

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  float fVar34;
  ulong uVar35;
  undefined8 uVar36;
  uint uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar78;
  float fVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar95;
  byte bVar96;
  ulong uVar97;
  uint uVar98;
  uint uVar99;
  long lVar100;
  ulong uVar101;
  Geometry *pGVar102;
  long lVar103;
  long lVar104;
  byte bVar105;
  ulong uVar106;
  float fVar107;
  float fVar108;
  float fVar164;
  float fVar166;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar135 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar115 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar116 [16];
  float fVar170;
  float fVar171;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined4 uVar186;
  float fVar187;
  undefined8 uVar188;
  undefined1 auVar189 [32];
  float fVar190;
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  float fVar223;
  float fVar225;
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  undefined1 (*local_7e8) [32];
  Precalculations *local_7e0;
  ulong local_7d8;
  LinearSpace3fa *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  int local_59c;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar97 = (ulong)(byte)prim[1];
  lVar103 = uVar97 * 0x25;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar97 * 4 + 6);
  auVar131 = vpmovsxbd_avx2(auVar110);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar97 * 5 + 6);
  auVar128 = vpmovsxbd_avx2(auVar109);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar97 * 6 + 6);
  auVar134 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar97 * 0xf + 6);
  auVar133 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar132 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar97 * 0x11 + 6);
  auVar129 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar97 * 0x1a + 6);
  auVar130 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar97 * 0x1b + 6);
  auVar123 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar97 * 0x1c + 6);
  auVar124 = vpmovsxbd_avx2(auVar12);
  uVar186 = *(undefined4 *)(prim + lVar103 + 0x12);
  auVar233._4_4_ = uVar186;
  auVar233._0_4_ = uVar186;
  auVar233._8_4_ = uVar186;
  auVar233._12_4_ = uVar186;
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar109 = vsubps_avx512vl(auVar110,*(undefined1 (*) [16])(prim + lVar103 + 6));
  fVar191 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar103 + 0x16)) *
            *(float *)(prim + lVar103 + 0x1a);
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 7 + 6));
  auVar136 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xb + 6));
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 9 + 6));
  auVar138 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xd + 6));
  auVar117 = vpbroadcastd_avx512vl();
  auVar110 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar110 = vinsertps_avx512f(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar109 = vmulps_avx512vl(auVar233,auVar109);
  auVar110 = vmulps_avx512vl(auVar233,auVar110);
  auVar118 = vcvtdq2ps_avx512vl(auVar131);
  auVar119 = vcvtdq2ps_avx512vl(auVar128);
  auVar120 = vcvtdq2ps_avx512vl(auVar134);
  auVar121 = vcvtdq2ps_avx512vl(auVar133);
  auVar122 = vcvtdq2ps_avx512vl(auVar132);
  auVar131 = vcvtdq2ps_avx(auVar129);
  auVar134 = vcvtdq2ps_avx(auVar130);
  auVar133 = vcvtdq2ps_avx(auVar123);
  auVar132 = vcvtdq2ps_avx(auVar124);
  uVar186 = auVar110._0_4_;
  auVar209._4_4_ = uVar186;
  auVar209._0_4_ = uVar186;
  auVar209._8_4_ = uVar186;
  auVar209._12_4_ = uVar186;
  auVar209._16_4_ = uVar186;
  auVar209._20_4_ = uVar186;
  auVar209._24_4_ = uVar186;
  auVar209._28_4_ = uVar186;
  auVar123 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar237 = ZEXT3264(auVar123);
  auVar124 = vpermps_avx512vl(auVar123,ZEXT1632(auVar110));
  auVar125 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar236 = ZEXT3264(auVar125);
  auVar126 = vpermps_avx512vl(auVar125,ZEXT1632(auVar110));
  auVar127 = vmulps_avx512vl(auVar126,auVar120);
  auVar129._4_4_ = auVar126._4_4_ * auVar131._4_4_;
  auVar129._0_4_ = auVar126._0_4_ * auVar131._0_4_;
  auVar129._8_4_ = auVar126._8_4_ * auVar131._8_4_;
  auVar129._12_4_ = auVar126._12_4_ * auVar131._12_4_;
  auVar129._16_4_ = auVar126._16_4_ * auVar131._16_4_;
  auVar129._20_4_ = auVar126._20_4_ * auVar131._20_4_;
  auVar129._24_4_ = auVar126._24_4_ * auVar131._24_4_;
  auVar129._28_4_ = auVar128._28_4_;
  auVar130._4_4_ = auVar132._4_4_ * auVar126._4_4_;
  auVar130._0_4_ = auVar132._0_4_ * auVar126._0_4_;
  auVar130._8_4_ = auVar132._8_4_ * auVar126._8_4_;
  auVar130._12_4_ = auVar132._12_4_ * auVar126._12_4_;
  auVar130._16_4_ = auVar132._16_4_ * auVar126._16_4_;
  auVar130._20_4_ = auVar132._20_4_ * auVar126._20_4_;
  auVar130._24_4_ = auVar132._24_4_ * auVar126._24_4_;
  auVar130._28_4_ = auVar126._28_4_;
  auVar128 = vfmadd231ps_avx512vl(auVar127,auVar124,auVar119);
  auVar129 = vfmadd231ps_avx512vl(auVar129,auVar124,auVar122);
  auVar110 = vfmadd231ps_fma(auVar130,auVar133,auVar124);
  auVar128 = vfmadd231ps_avx512vl(auVar128,auVar209,auVar118);
  auVar129 = vfmadd231ps_avx512vl(auVar129,auVar209,auVar121);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar134,auVar209);
  auVar130 = vbroadcastss_avx512vl(auVar109);
  auVar123 = vpermps_avx512vl(auVar123,ZEXT1632(auVar109));
  auVar124 = vpermps_avx512vl(auVar125,ZEXT1632(auVar109));
  auVar120 = vmulps_avx512vl(auVar124,auVar120);
  auVar131 = vmulps_avx512vl(auVar124,auVar131);
  auVar132 = vmulps_avx512vl(auVar124,auVar132);
  auVar124 = vfmadd231ps_avx512vl(auVar120,auVar123,auVar119);
  auVar131 = vfmadd231ps_avx512vl(auVar131,auVar123,auVar122);
  auVar133 = vfmadd231ps_avx512vl(auVar132,auVar123,auVar133);
  auVar132 = vfmadd231ps_avx512vl(auVar124,auVar130,auVar118);
  auVar118 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar121);
  auVar233 = vfmadd231ps_fma(auVar133,auVar130,auVar134);
  auVar126._8_4_ = 0x7fffffff;
  auVar126._0_8_ = 0x7fffffff7fffffff;
  auVar126._12_4_ = 0x7fffffff;
  auVar126._16_4_ = 0x7fffffff;
  auVar126._20_4_ = 0x7fffffff;
  auVar126._24_4_ = 0x7fffffff;
  auVar126._28_4_ = 0x7fffffff;
  auVar131 = vandps_avx(auVar126,auVar128);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  uVar101 = vcmpps_avx512vl(auVar131,auVar122,1);
  bVar20 = (bool)((byte)uVar101 & 1);
  auVar119._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._0_4_;
  bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._4_4_;
  bVar20 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._8_4_;
  bVar20 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._12_4_;
  bVar20 = (bool)((byte)(uVar101 >> 4) & 1);
  auVar119._16_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._16_4_;
  bVar20 = (bool)((byte)(uVar101 >> 5) & 1);
  auVar119._20_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._20_4_;
  bVar20 = (bool)((byte)(uVar101 >> 6) & 1);
  auVar119._24_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._24_4_;
  bVar20 = SUB81(uVar101 >> 7,0);
  auVar119._28_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar128._28_4_;
  auVar131 = vandps_avx(auVar126,auVar129);
  uVar101 = vcmpps_avx512vl(auVar131,auVar122,1);
  bVar20 = (bool)((byte)uVar101 & 1);
  auVar120._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._0_4_;
  bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar120._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._4_4_;
  bVar20 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar120._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._8_4_;
  bVar20 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar120._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._12_4_;
  bVar20 = (bool)((byte)(uVar101 >> 4) & 1);
  auVar120._16_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._16_4_;
  bVar20 = (bool)((byte)(uVar101 >> 5) & 1);
  auVar120._20_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._20_4_;
  bVar20 = (bool)((byte)(uVar101 >> 6) & 1);
  auVar120._24_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._24_4_;
  bVar20 = SUB81(uVar101 >> 7,0);
  auVar120._28_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar129._28_4_;
  auVar131 = vandps_avx(auVar126,ZEXT1632(auVar110));
  uVar101 = vcmpps_avx512vl(auVar131,auVar122,1);
  bVar20 = (bool)((byte)uVar101 & 1);
  auVar131._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar110._0_4_;
  bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
  auVar131._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar110._4_4_;
  bVar20 = (bool)((byte)(uVar101 >> 2) & 1);
  auVar131._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar110._8_4_;
  bVar20 = (bool)((byte)(uVar101 >> 3) & 1);
  auVar131._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar110._12_4_;
  auVar131._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * 0x219392ef;
  auVar131._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * 0x219392ef;
  auVar131._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * 0x219392ef;
  auVar131._28_4_ = (uint)(byte)(uVar101 >> 7) * 0x219392ef;
  auVar134 = vrcp14ps_avx512vl(auVar119);
  auVar125._8_4_ = 0x3f800000;
  auVar125._0_8_ = 0x3f8000003f800000;
  auVar125._12_4_ = 0x3f800000;
  auVar125._16_4_ = 0x3f800000;
  auVar125._20_4_ = 0x3f800000;
  auVar125._24_4_ = 0x3f800000;
  auVar125._28_4_ = 0x3f800000;
  auVar110 = vfnmadd213ps_fma(auVar119,auVar134,auVar125);
  auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar134,auVar134);
  auVar134 = vrcp14ps_avx512vl(auVar120);
  auVar109 = vfnmadd213ps_fma(auVar120,auVar134,auVar125);
  auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar134,auVar134);
  auVar134 = vrcp14ps_avx512vl(auVar131);
  auVar6 = vfnmadd213ps_fma(auVar131,auVar134,auVar125);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar134,auVar134);
  auVar121._4_4_ = fVar191;
  auVar121._0_4_ = fVar191;
  auVar121._8_4_ = fVar191;
  auVar121._12_4_ = fVar191;
  auVar121._16_4_ = fVar191;
  auVar121._20_4_ = fVar191;
  auVar121._24_4_ = fVar191;
  auVar121._28_4_ = fVar191;
  auVar131 = vcvtdq2ps_avx(auVar135);
  auVar134 = vcvtdq2ps_avx(auVar136);
  auVar134 = vsubps_avx(auVar134,auVar131);
  auVar7 = vfmadd213ps_fma(auVar134,auVar121,auVar131);
  auVar131 = vcvtdq2ps_avx(auVar137);
  auVar134 = vcvtdq2ps_avx(auVar138);
  auVar134 = vsubps_avx(auVar134,auVar131);
  auVar8 = vfmadd213ps_fma(auVar134,auVar121,auVar131);
  auVar131 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x12 + 6));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x16 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar131);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x14 + 6));
  auVar9 = vfmadd213ps_fma(auVar134,auVar121,auVar131);
  auVar131 = vcvtdq2ps_avx(auVar133);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x18 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar131);
  auVar10 = vfmadd213ps_fma(auVar134,auVar121,auVar131);
  auVar131 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x1d + 6));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x21 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar131);
  auVar11 = vfmadd213ps_fma(auVar134,auVar121,auVar131);
  auVar131 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x1f + 6));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x23 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar131);
  auVar12 = vfmadd213ps_fma(auVar134,auVar121,auVar131);
  auVar131 = vsubps_avx(ZEXT1632(auVar7),auVar132);
  auVar123._4_4_ = auVar110._4_4_ * auVar131._4_4_;
  auVar123._0_4_ = auVar110._0_4_ * auVar131._0_4_;
  auVar123._8_4_ = auVar110._8_4_ * auVar131._8_4_;
  auVar123._12_4_ = auVar110._12_4_ * auVar131._12_4_;
  auVar123._16_4_ = auVar131._16_4_ * 0.0;
  auVar123._20_4_ = auVar131._20_4_ * 0.0;
  auVar123._24_4_ = auVar131._24_4_ * 0.0;
  auVar123._28_4_ = auVar131._28_4_;
  auVar131 = vsubps_avx(ZEXT1632(auVar8),auVar132);
  auVar138._0_4_ = auVar110._0_4_ * auVar131._0_4_;
  auVar138._4_4_ = auVar110._4_4_ * auVar131._4_4_;
  auVar138._8_4_ = auVar110._8_4_ * auVar131._8_4_;
  auVar138._12_4_ = auVar110._12_4_ * auVar131._12_4_;
  auVar138._16_4_ = auVar131._16_4_ * 0.0;
  auVar138._20_4_ = auVar131._20_4_ * 0.0;
  auVar138._24_4_ = auVar131._24_4_ * 0.0;
  auVar138._28_4_ = 0;
  auVar131 = vsubps_avx(ZEXT1632(auVar9),auVar118);
  auVar124._4_4_ = auVar109._4_4_ * auVar131._4_4_;
  auVar124._0_4_ = auVar109._0_4_ * auVar131._0_4_;
  auVar124._8_4_ = auVar109._8_4_ * auVar131._8_4_;
  auVar124._12_4_ = auVar109._12_4_ * auVar131._12_4_;
  auVar124._16_4_ = auVar131._16_4_ * 0.0;
  auVar124._20_4_ = auVar131._20_4_ * 0.0;
  auVar124._24_4_ = auVar131._24_4_ * 0.0;
  auVar124._28_4_ = auVar131._28_4_;
  auVar131 = vsubps_avx(ZEXT1632(auVar10),auVar118);
  auVar137._0_4_ = auVar109._0_4_ * auVar131._0_4_;
  auVar137._4_4_ = auVar109._4_4_ * auVar131._4_4_;
  auVar137._8_4_ = auVar109._8_4_ * auVar131._8_4_;
  auVar137._12_4_ = auVar109._12_4_ * auVar131._12_4_;
  auVar137._16_4_ = auVar131._16_4_ * 0.0;
  auVar137._20_4_ = auVar131._20_4_ * 0.0;
  auVar137._24_4_ = auVar131._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar131 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar233));
  auVar135._4_4_ = auVar6._4_4_ * auVar131._4_4_;
  auVar135._0_4_ = auVar6._0_4_ * auVar131._0_4_;
  auVar135._8_4_ = auVar6._8_4_ * auVar131._8_4_;
  auVar135._12_4_ = auVar6._12_4_ * auVar131._12_4_;
  auVar135._16_4_ = auVar131._16_4_ * 0.0;
  auVar135._20_4_ = auVar131._20_4_ * 0.0;
  auVar135._24_4_ = auVar131._24_4_ * 0.0;
  auVar135._28_4_ = auVar131._28_4_;
  auVar131 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar233));
  auVar136._0_4_ = auVar6._0_4_ * auVar131._0_4_;
  auVar136._4_4_ = auVar6._4_4_ * auVar131._4_4_;
  auVar136._8_4_ = auVar6._8_4_ * auVar131._8_4_;
  auVar136._12_4_ = auVar6._12_4_ * auVar131._12_4_;
  auVar136._16_4_ = auVar131._16_4_ * 0.0;
  auVar136._20_4_ = auVar131._20_4_ * 0.0;
  auVar136._24_4_ = auVar131._24_4_ * 0.0;
  auVar136._28_4_ = 0;
  auVar131 = vpminsd_avx2(auVar123,auVar138);
  auVar134 = vpminsd_avx2(auVar124,auVar137);
  auVar131 = vmaxps_avx(auVar131,auVar134);
  auVar134 = vpminsd_avx2(auVar135,auVar136);
  uVar186 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar133._4_4_ = uVar186;
  auVar133._0_4_ = uVar186;
  auVar133._8_4_ = uVar186;
  auVar133._12_4_ = uVar186;
  auVar133._16_4_ = uVar186;
  auVar133._20_4_ = uVar186;
  auVar133._24_4_ = uVar186;
  auVar133._28_4_ = uVar186;
  auVar134 = vmaxps_avx512vl(auVar134,auVar133);
  auVar131 = vmaxps_avx(auVar131,auVar134);
  auVar134._8_4_ = 0x3f7ffffa;
  auVar134._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar134._12_4_ = 0x3f7ffffa;
  auVar134._16_4_ = 0x3f7ffffa;
  auVar134._20_4_ = 0x3f7ffffa;
  auVar134._24_4_ = 0x3f7ffffa;
  auVar134._28_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar131,auVar134);
  auVar131 = vpmaxsd_avx2(auVar123,auVar138);
  auVar134 = vpmaxsd_avx2(auVar124,auVar137);
  auVar131 = vminps_avx(auVar131,auVar134);
  auVar134 = vpmaxsd_avx2(auVar135,auVar136);
  uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar132._4_4_ = uVar186;
  auVar132._0_4_ = uVar186;
  auVar132._8_4_ = uVar186;
  auVar132._12_4_ = uVar186;
  auVar132._16_4_ = uVar186;
  auVar132._20_4_ = uVar186;
  auVar132._24_4_ = uVar186;
  auVar132._28_4_ = uVar186;
  auVar134 = vminps_avx512vl(auVar134,auVar132);
  auVar131 = vminps_avx(auVar131,auVar134);
  auVar128._8_4_ = 0x3f800003;
  auVar128._0_8_ = 0x3f8000033f800003;
  auVar128._12_4_ = 0x3f800003;
  auVar128._16_4_ = 0x3f800003;
  auVar128._20_4_ = 0x3f800003;
  auVar128._24_4_ = 0x3f800003;
  auVar128._28_4_ = 0x3f800003;
  auVar131 = vmulps_avx512vl(auVar131,auVar128);
  uVar188 = vcmpps_avx512vl(local_3a0,auVar131,2);
  uVar36 = vpcmpgtd_avx512vl(auVar117,_DAT_01fb4ba0);
  local_7c8 = (ulong)(byte)((byte)uVar188 & (byte)uVar36);
  local_7d0 = pre->ray_space + k;
  local_7e8 = (undefined1 (*) [32])local_100;
  auVar185 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar185);
  local_7e0 = pre;
  do {
    auVar131 = local_7a0;
    if (local_7c8 == 0) {
      return;
    }
    lVar103 = 0;
    for (uVar101 = local_7c8; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
      lVar103 = lVar103 + 1;
    }
    uVar13 = *(uint *)(prim + 2);
    uVar99 = *(uint *)(prim + lVar103 * 4 + 6);
    uVar101 = (ulong)uVar99;
    pGVar102 = (context->scene->geometries).items[uVar13].ptr;
    uVar97 = (ulong)*(uint *)(*(long *)&pGVar102->field_0x58 +
                             uVar101 * pGVar102[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i);
    fVar191 = (pGVar102->time_range).lower;
    fVar191 = pGVar102->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x1c0) - fVar191) /
              ((pGVar102->time_range).upper - fVar191));
    auVar110 = vroundss_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),9);
    auVar110 = vminss_avx(auVar110,ZEXT416((uint)(pGVar102->fnumTimeSegments + -1.0)));
    auVar110 = vmaxss_avx(ZEXT816(0) << 0x20,auVar110);
    fVar191 = fVar191 - auVar110._0_4_;
    fVar34 = 1.0 - fVar191;
    _Var16 = pGVar102[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar104 = (long)(int)auVar110._0_4_ * 0x38;
    lVar100 = *(long *)(_Var16 + 0x10 + lVar104);
    lVar17 = *(long *)(_Var16 + 0x38 + lVar104);
    lVar18 = *(long *)(_Var16 + 0x48 + lVar104);
    auVar172._4_4_ = fVar191;
    auVar172._0_4_ = fVar191;
    auVar172._8_4_ = fVar191;
    auVar172._12_4_ = fVar191;
    pfVar3 = (float *)(lVar17 + lVar18 * uVar97);
    auVar111._0_4_ = fVar191 * *pfVar3;
    auVar111._4_4_ = fVar191 * pfVar3[1];
    auVar111._8_4_ = fVar191 * pfVar3[2];
    auVar111._12_4_ = fVar191 * pfVar3[3];
    lVar103 = uVar97 + 1;
    auVar110 = vmulps_avx512vl(auVar172,*(undefined1 (*) [16])(lVar17 + lVar18 * lVar103));
    p_Var19 = pGVar102[4].occlusionFilterN;
    auVar113._4_4_ = fVar34;
    auVar113._0_4_ = fVar34;
    auVar113._8_4_ = fVar34;
    auVar113._12_4_ = fVar34;
    auVar7 = vfmadd231ps_fma(auVar111,auVar113,
                             *(undefined1 (*) [16])(*(long *)(_Var16 + lVar104) + lVar100 * uVar97))
    ;
    auVar111 = vfmadd231ps_avx512vl
                         (auVar110,auVar113,
                          *(undefined1 (*) [16])(*(long *)(_Var16 + lVar104) + lVar100 * lVar103));
    pfVar3 = (float *)(*(long *)(p_Var19 + lVar104 + 0x38) +
                      uVar97 * *(long *)(p_Var19 + lVar104 + 0x48));
    auVar231._0_4_ = fVar191 * *pfVar3;
    auVar231._4_4_ = fVar191 * pfVar3[1];
    auVar231._8_4_ = fVar191 * pfVar3[2];
    auVar231._12_4_ = fVar191 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var19 + lVar104 + 0x38) +
                      *(long *)(p_Var19 + lVar104 + 0x48) * lVar103);
    auVar232._0_4_ = fVar191 * *pfVar3;
    auVar232._4_4_ = fVar191 * pfVar3[1];
    auVar232._8_4_ = fVar191 * pfVar3[2];
    auVar232._12_4_ = fVar191 * pfVar3[3];
    auVar109 = vfmadd231ps_fma(auVar231,auVar113,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var19 + lVar104) +
                                *(long *)(p_Var19 + lVar104 + 0x10) * uVar97));
    auVar6 = vfmadd231ps_fma(auVar232,auVar113,
                             *(undefined1 (*) [16])
                              (*(long *)(p_Var19 + lVar104) +
                              *(long *)(p_Var19 + lVar104 + 0x10) * lVar103));
    auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    iVar14 = (int)pGVar102[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar112._8_4_ = 0xbeaaaaab;
    auVar112._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar112._12_4_ = 0xbeaaaaab;
    auVar172 = vfnmadd213ps_fma(auVar109,auVar112,auVar7);
    auVar112 = vfmadd213ps_avx512vl(auVar6,auVar112,auVar111);
    auVar6 = vsubps_avx(auVar7,auVar110);
    uVar186 = auVar6._0_4_;
    auVar114._4_4_ = uVar186;
    auVar114._0_4_ = uVar186;
    auVar114._8_4_ = uVar186;
    auVar114._12_4_ = uVar186;
    auVar109 = vshufps_avx(auVar6,auVar6,0x55);
    aVar4 = (local_7d0->vx).field_0;
    aVar5 = (local_7d0->vy).field_0;
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    fVar191 = (local_7d0->vz).field_0.m128[0];
    fVar34 = *(float *)((long)&(local_7d0->vz).field_0 + 4);
    fVar78 = *(float *)((long)&(local_7d0->vz).field_0 + 8);
    fVar79 = *(float *)((long)&(local_7d0->vz).field_0 + 0xc);
    auVar224._0_4_ = fVar191 * auVar6._0_4_;
    auVar224._4_4_ = fVar34 * auVar6._4_4_;
    auVar224._8_4_ = fVar78 * auVar6._8_4_;
    auVar224._12_4_ = fVar79 * auVar6._12_4_;
    auVar109 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar109);
    auVar8 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar114);
    auVar6 = vsubps_avx(auVar172,auVar110);
    uVar186 = auVar6._0_4_;
    auVar115._4_4_ = uVar186;
    auVar115._0_4_ = uVar186;
    auVar115._8_4_ = uVar186;
    auVar115._12_4_ = uVar186;
    auVar109 = vshufps_avx(auVar6,auVar6,0x55);
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar226._0_4_ = fVar191 * auVar6._0_4_;
    auVar226._4_4_ = fVar34 * auVar6._4_4_;
    auVar226._8_4_ = fVar78 * auVar6._8_4_;
    auVar226._12_4_ = fVar79 * auVar6._12_4_;
    auVar109 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar109);
    auVar9 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar115);
    auVar6 = vsubps_avx(auVar112,auVar110);
    uVar186 = auVar6._0_4_;
    auVar116._4_4_ = uVar186;
    auVar116._0_4_ = uVar186;
    auVar116._8_4_ = uVar186;
    auVar116._12_4_ = uVar186;
    auVar109 = vshufps_avx(auVar6,auVar6,0x55);
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar228._0_4_ = fVar191 * auVar6._0_4_;
    auVar228._4_4_ = fVar34 * auVar6._4_4_;
    auVar228._8_4_ = fVar78 * auVar6._8_4_;
    auVar228._12_4_ = fVar79 * auVar6._12_4_;
    auVar109 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar5,auVar109);
    auVar6 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar4,auVar116);
    auVar109 = vsubps_avx512vl(auVar111,auVar110);
    uVar186 = auVar109._0_4_;
    auVar200._4_4_ = uVar186;
    auVar200._0_4_ = uVar186;
    auVar200._8_4_ = uVar186;
    auVar200._12_4_ = uVar186;
    auVar110 = vshufps_avx(auVar109,auVar109,0x55);
    auVar109 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar230._0_4_ = fVar191 * auVar109._0_4_;
    auVar230._4_4_ = fVar34 * auVar109._4_4_;
    auVar230._8_4_ = fVar78 * auVar109._8_4_;
    auVar230._12_4_ = fVar79 * auVar109._12_4_;
    auVar110 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar5,auVar110);
    lVar103 = (long)iVar14 * 0x44;
    auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar103);
    auVar10 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar200);
    uVar186 = auVar8._0_4_;
    local_620._4_4_ = uVar186;
    local_620._0_4_ = uVar186;
    local_620._8_4_ = uVar186;
    local_620._12_4_ = uVar186;
    local_620._16_4_ = uVar186;
    local_620._20_4_ = uVar186;
    local_620._24_4_ = uVar186;
    local_620._28_4_ = uVar186;
    auVar121 = auVar237._0_32_;
    local_640 = vpermps_avx512vl(auVar121,ZEXT1632(auVar8));
    auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0x484);
    uVar186 = auVar9._0_4_;
    auVar201._4_4_ = uVar186;
    auVar201._0_4_ = uVar186;
    auVar201._8_4_ = uVar186;
    auVar201._12_4_ = uVar186;
    local_660._16_4_ = uVar186;
    local_660._0_16_ = auVar201;
    local_660._20_4_ = uVar186;
    local_660._24_4_ = uVar186;
    local_660._28_4_ = uVar186;
    local_680 = vpermps_avx512vl(auVar121,ZEXT1632(auVar9));
    auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0x908);
    local_6a0 = vbroadcastss_avx512vl(auVar6);
    auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0xd8c);
    local_6c0 = vpermps_avx512vl(auVar121,ZEXT1632(auVar6));
    uVar186 = auVar10._0_4_;
    local_6e0._4_4_ = uVar186;
    local_6e0._0_4_ = uVar186;
    fStack_6d8 = (float)uVar186;
    fStack_6d4 = (float)uVar186;
    fStack_6d0 = (float)uVar186;
    fStack_6cc = (float)uVar186;
    fStack_6c8 = (float)uVar186;
    register0x0000139c = uVar186;
    _local_700 = vpermps_avx512vl(auVar121,ZEXT1632(auVar10));
    auVar129 = vmulps_avx512vl(_local_6e0,auVar128);
    auVar130 = vmulps_avx512vl(_local_700,auVar128);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar132,local_6a0);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar132,local_6c0);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar133,local_660);
    auVar135 = vfmadd231ps_avx512vl(auVar130,auVar133,local_680);
    auVar136 = vfmadd231ps_avx512vl(auVar129,auVar134,local_620);
    auVar219 = ZEXT3264(auVar136);
    auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar103);
    auVar130 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0x484);
    auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0x908);
    auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0xd8c);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar134,local_640);
    auVar214 = ZEXT3264(auVar135);
    auVar137 = vmulps_avx512vl(_local_6e0,auVar124);
    auVar138 = vmulps_avx512vl(_local_700,auVar124);
    auVar137 = vfmadd231ps_avx512vl(auVar137,auVar123,local_6a0);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar123,local_6c0);
    auVar137 = vfmadd231ps_avx512vl(auVar137,auVar130,local_660);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar130,local_680);
    auVar11 = vfmadd231ps_fma(auVar137,auVar129,local_620);
    auVar221 = ZEXT1664(auVar11);
    auVar12 = vfmadd231ps_fma(auVar138,auVar129,local_640);
    auVar137 = vsubps_avx512vl(ZEXT1632(auVar11),auVar136);
    auVar138 = vsubps_avx512vl(ZEXT1632(auVar12),auVar135);
    auVar117 = vmulps_avx512vl(auVar135,auVar137);
    auVar118 = vmulps_avx512vl(auVar136,auVar138);
    auVar117 = vsubps_avx512vl(auVar117,auVar118);
    auVar110 = vshufps_avx(auVar7,auVar7,0xff);
    uVar188 = auVar110._0_8_;
    local_3c0._8_8_ = uVar188;
    local_3c0._0_8_ = uVar188;
    local_3c0._16_8_ = uVar188;
    local_3c0._24_8_ = uVar188;
    auVar110 = vshufps_avx(auVar172,auVar172,0xff);
    local_3e0 = vbroadcastsd_avx512vl(auVar110);
    auVar110 = vshufps_avx(auVar112,auVar112,0xff);
    local_400 = vbroadcastsd_avx512vl(auVar110);
    auVar110 = vshufps_avx512vl(auVar111,auVar111,0xff);
    uVar188 = auVar110._0_8_;
    local_420._8_8_ = uVar188;
    local_420._0_8_ = uVar188;
    local_420._16_8_ = uVar188;
    local_420._24_8_ = uVar188;
    auVar118 = vmulps_avx512vl(local_420,auVar128);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar132,local_400);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar133,local_3e0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar134,local_3c0);
    auVar119 = vmulps_avx512vl(local_420,auVar124);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_400);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar130,local_3e0);
    auVar233 = vfmadd231ps_fma(auVar119,auVar129,local_3c0);
    auVar119 = vmulps_avx512vl(auVar138,auVar138);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar137,auVar137);
    auVar120 = vmaxps_avx512vl(auVar118,ZEXT1632(auVar233));
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vmulps_avx512vl(auVar120,auVar119);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    uVar188 = vcmpps_avx512vl(auVar117,auVar119,2);
    auVar110 = vblendps_avx(auVar8,auVar7,8);
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar109 = vandps_avx512vl(auVar110,auVar113);
    auVar110 = vblendps_avx(auVar9,auVar172,8);
    auVar110 = vandps_avx512vl(auVar110,auVar113);
    auVar109 = vmaxps_avx(auVar109,auVar110);
    auVar110 = vblendps_avx(auVar6,auVar112,8);
    auVar114 = vandps_avx512vl(auVar110,auVar113);
    auVar110 = vblendps_avx(auVar10,auVar111,8);
    auVar110 = vandps_avx512vl(auVar110,auVar113);
    auVar110 = vmaxps_avx(auVar114,auVar110);
    auVar110 = vmaxps_avx(auVar109,auVar110);
    auVar109 = vmovshdup_avx(auVar110);
    auVar109 = vmaxss_avx(auVar109,auVar110);
    auVar110 = vshufpd_avx(auVar110,auVar110,1);
    auVar110 = vmaxss_avx(auVar110,auVar109);
    auVar117._0_4_ = (float)iVar14;
    local_7a0._4_12_ = auVar112._4_12_;
    local_7a0._0_4_ = auVar117._0_4_;
    local_7a0._16_16_ = auVar131._16_16_;
    auVar117._4_4_ = auVar117._0_4_;
    auVar117._8_4_ = auVar117._0_4_;
    auVar117._12_4_ = auVar117._0_4_;
    auVar117._16_4_ = auVar117._0_4_;
    auVar117._20_4_ = auVar117._0_4_;
    auVar117._24_4_ = auVar117._0_4_;
    auVar117._28_4_ = auVar117._0_4_;
    uVar36 = vcmpps_avx512vl(auVar117,_DAT_01f7b060,0xe);
    bVar105 = (byte)uVar188 & (byte)uVar36;
    fVar191 = auVar110._0_4_ * 4.7683716e-07;
    local_800 = ZEXT416((uint)fVar191);
    auVar131 = auVar236._0_32_;
    local_480 = vpermps_avx512vl(auVar131,ZEXT1632(auVar8));
    local_4a0 = vpermps_avx512vl(auVar131,ZEXT1632(auVar9));
    local_4c0 = vpermps_avx512vl(auVar131,ZEXT1632(auVar6));
    local_4e0 = vpermps_avx512vl(auVar131,ZEXT1632(auVar10));
    local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar185 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar185);
    auVar185 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar185);
    local_840 = auVar7._0_8_;
    uStack_838 = auVar7._8_8_;
    local_860 = auVar172._0_8_;
    uStack_858 = auVar172._8_8_;
    local_870 = auVar112._0_8_;
    uStack_868 = auVar112._8_8_;
    local_850._0_4_ = auVar111._0_4_;
    fVar34 = (float)local_850;
    local_850._4_4_ = auVar111._4_4_;
    fVar78 = local_850._4_4_;
    uStack_848._0_4_ = auVar111._8_4_;
    fVar79 = (float)uStack_848;
    uStack_848._4_4_ = auVar111._12_4_;
    fVar95 = uStack_848._4_4_;
    local_850 = auVar111._0_8_;
    uStack_848 = auVar111._8_8_;
    if (bVar105 != 0) {
      auVar131 = vmulps_avx512vl(local_4e0,auVar124);
      auVar131 = vfmadd213ps_avx512vl(auVar123,local_4c0,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar130,local_4a0,auVar131);
      auVar129 = vfmadd213ps_avx512vl(auVar129,local_480,auVar131);
      auVar131 = vmulps_avx512vl(local_4e0,auVar128);
      auVar131 = vfmadd213ps_avx512vl(auVar132,local_4c0,auVar131);
      auVar130 = vfmadd213ps_avx512vl(auVar133,local_4a0,auVar131);
      auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0x1210);
      auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0x1694);
      auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0x1b18);
      auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar103 + 0x1f9c);
      auVar130 = vfmadd213ps_avx512vl(auVar134,local_480,auVar130);
      auVar134 = vmulps_avx512vl(_local_6e0,auVar128);
      auVar123 = vmulps_avx512vl(_local_700,auVar128);
      auVar128 = vmulps_avx512vl(local_4e0,auVar128);
      auVar134 = vfmadd231ps_avx512vl(auVar134,auVar132,local_6a0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,auVar132,local_6c0);
      auVar132 = vfmadd231ps_avx512vl(auVar128,local_4c0,auVar132);
      auVar134 = vfmadd231ps_avx512vl(auVar134,auVar133,local_660);
      auVar128 = vfmadd231ps_avx512vl(auVar123,auVar133,local_680);
      auVar123 = vfmadd231ps_avx512vl(auVar132,local_4a0,auVar133);
      auVar110 = vfmadd231ps_fma(auVar134,auVar131,local_620);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar131,local_640);
      auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0x1210);
      auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0x1b18);
      auVar132 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0x1f9c);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_480,auVar131);
      auVar131 = vmulps_avx512vl(_local_6e0,auVar132);
      auVar124 = vmulps_avx512vl(_local_700,auVar132);
      auVar132 = vmulps_avx512vl(local_4e0,auVar132);
      auVar119 = vfmadd231ps_avx512vl(auVar131,auVar133,local_6a0);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar133,local_6c0);
      auVar133 = vfmadd231ps_avx512vl(auVar132,local_4c0,auVar133);
      auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 + 0x1694);
      auVar132 = vfmadd231ps_avx512vl(auVar119,auVar131,local_660);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar131,local_680);
      auVar131 = vfmadd231ps_avx512vl(auVar133,local_4a0,auVar131);
      auVar109 = vfmadd231ps_fma(auVar132,auVar134,local_620);
      auVar133 = vfmadd231ps_avx512vl(auVar124,auVar134,local_640);
      auVar132 = vfmadd231ps_avx512vl(auVar131,local_480,auVar134);
      auVar237 = ZEXT3264(auVar121);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar236 = ZEXT3264(auVar131);
      auVar234._8_4_ = 0x7fffffff;
      auVar234._0_8_ = 0x7fffffff7fffffff;
      auVar234._12_4_ = 0x7fffffff;
      auVar234._16_4_ = 0x7fffffff;
      auVar234._20_4_ = 0x7fffffff;
      auVar234._24_4_ = 0x7fffffff;
      auVar234._28_4_ = 0x7fffffff;
      auVar131 = vandps_avx(ZEXT1632(auVar110),auVar234);
      auVar134 = vandps_avx(auVar128,auVar234);
      auVar134 = vmaxps_avx(auVar131,auVar134);
      auVar131 = vandps_avx(auVar123,auVar234);
      auVar131 = vmaxps_avx(auVar134,auVar131);
      auVar229._4_4_ = fVar191;
      auVar229._0_4_ = fVar191;
      auVar229._8_4_ = fVar191;
      auVar229._12_4_ = fVar191;
      auVar229._16_4_ = fVar191;
      auVar229._20_4_ = fVar191;
      auVar229._24_4_ = fVar191;
      auVar229._28_4_ = fVar191;
      uVar97 = vcmpps_avx512vl(auVar131,auVar229,1);
      bVar20 = (bool)((byte)uVar97 & 1);
      auVar139._0_4_ = (float)((uint)bVar20 * auVar137._0_4_ | (uint)!bVar20 * auVar110._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar139._4_4_ = (float)((uint)bVar20 * auVar137._4_4_ | (uint)!bVar20 * auVar110._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar139._8_4_ = (float)((uint)bVar20 * auVar137._8_4_ | (uint)!bVar20 * auVar110._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar139._12_4_ = (float)((uint)bVar20 * auVar137._12_4_ | (uint)!bVar20 * auVar110._12_4_);
      fVar225 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar137._16_4_);
      auVar139._16_4_ = fVar225;
      fVar223 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar137._20_4_);
      auVar139._20_4_ = fVar223;
      fVar187 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar137._24_4_);
      auVar139._24_4_ = fVar187;
      uVar98 = (uint)(byte)(uVar97 >> 7) * auVar137._28_4_;
      auVar139._28_4_ = uVar98;
      bVar20 = (bool)((byte)uVar97 & 1);
      auVar140._0_4_ = (float)((uint)bVar20 * auVar138._0_4_ | (uint)!bVar20 * auVar128._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar140._4_4_ = (float)((uint)bVar20 * auVar138._4_4_ | (uint)!bVar20 * auVar128._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar140._8_4_ = (float)((uint)bVar20 * auVar138._8_4_ | (uint)!bVar20 * auVar128._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar140._12_4_ = (float)((uint)bVar20 * auVar138._12_4_ | (uint)!bVar20 * auVar128._12_4_);
      bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar140._16_4_ = (float)((uint)bVar20 * auVar138._16_4_ | (uint)!bVar20 * auVar128._16_4_);
      bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar140._20_4_ = (float)((uint)bVar20 * auVar138._20_4_ | (uint)!bVar20 * auVar128._20_4_);
      bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar140._24_4_ = (float)((uint)bVar20 * auVar138._24_4_ | (uint)!bVar20 * auVar128._24_4_);
      bVar20 = SUB81(uVar97 >> 7,0);
      auVar140._28_4_ = (uint)bVar20 * auVar138._28_4_ | (uint)!bVar20 * auVar128._28_4_;
      auVar131 = vandps_avx(auVar234,ZEXT1632(auVar109));
      auVar134 = vandps_avx(auVar133,auVar234);
      auVar134 = vmaxps_avx(auVar131,auVar134);
      auVar131 = vandps_avx(auVar132,auVar234);
      auVar131 = vmaxps_avx(auVar134,auVar131);
      uVar97 = vcmpps_avx512vl(auVar131,auVar229,1);
      bVar20 = (bool)((byte)uVar97 & 1);
      auVar141._0_4_ = (float)((uint)bVar20 * auVar137._0_4_ | (uint)!bVar20 * auVar109._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar141._4_4_ = (float)((uint)bVar20 * auVar137._4_4_ | (uint)!bVar20 * auVar109._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar141._8_4_ = (float)((uint)bVar20 * auVar137._8_4_ | (uint)!bVar20 * auVar109._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar141._12_4_ = (float)((uint)bVar20 * auVar137._12_4_ | (uint)!bVar20 * auVar109._12_4_);
      fVar199 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar137._16_4_);
      auVar141._16_4_ = fVar199;
      fVar190 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar137._20_4_);
      auVar141._20_4_ = fVar190;
      fVar198 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar137._24_4_);
      auVar141._24_4_ = fVar198;
      auVar141._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar137._28_4_;
      bVar20 = (bool)((byte)uVar97 & 1);
      auVar142._0_4_ = (float)((uint)bVar20 * auVar138._0_4_ | (uint)!bVar20 * auVar133._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar142._4_4_ = (float)((uint)bVar20 * auVar138._4_4_ | (uint)!bVar20 * auVar133._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar142._8_4_ = (float)((uint)bVar20 * auVar138._8_4_ | (uint)!bVar20 * auVar133._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar142._12_4_ = (float)((uint)bVar20 * auVar138._12_4_ | (uint)!bVar20 * auVar133._12_4_);
      bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar142._16_4_ = (float)((uint)bVar20 * auVar138._16_4_ | (uint)!bVar20 * auVar133._16_4_);
      bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar142._20_4_ = (float)((uint)bVar20 * auVar138._20_4_ | (uint)!bVar20 * auVar133._20_4_);
      bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar142._24_4_ = (float)((uint)bVar20 * auVar138._24_4_ | (uint)!bVar20 * auVar133._24_4_);
      bVar20 = SUB81(uVar97 >> 7,0);
      auVar142._28_4_ = (uint)bVar20 * auVar138._28_4_ | (uint)!bVar20 * auVar133._28_4_;
      auVar115 = vxorps_avx512vl(auVar201,auVar201);
      auVar131 = vfmadd213ps_avx512vl(auVar139,auVar139,ZEXT1632(auVar115));
      auVar110 = vfmadd231ps_fma(auVar131,auVar140,auVar140);
      auVar131 = vrsqrt14ps_avx512vl(ZEXT1632(auVar110));
      fVar107 = auVar131._0_4_;
      fVar108 = auVar131._4_4_;
      fVar164 = auVar131._8_4_;
      fVar165 = auVar131._12_4_;
      fVar166 = auVar131._16_4_;
      fVar167 = auVar131._20_4_;
      fVar168 = auVar131._24_4_;
      auVar127._4_4_ = fVar108 * fVar108 * fVar108 * auVar110._4_4_ * -0.5;
      auVar127._0_4_ = fVar107 * fVar107 * fVar107 * auVar110._0_4_ * -0.5;
      auVar127._8_4_ = fVar164 * fVar164 * fVar164 * auVar110._8_4_ * -0.5;
      auVar127._12_4_ = fVar165 * fVar165 * fVar165 * auVar110._12_4_ * -0.5;
      auVar127._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar127._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar127._24_4_ = fVar168 * fVar168 * fVar168 * -0.0;
      auVar127._28_4_ = 0;
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar133 = vfmadd231ps_avx512vl(auVar127,auVar134,auVar131);
      auVar46._4_4_ = auVar140._4_4_ * auVar133._4_4_;
      auVar46._0_4_ = auVar140._0_4_ * auVar133._0_4_;
      auVar46._8_4_ = auVar140._8_4_ * auVar133._8_4_;
      auVar46._12_4_ = auVar140._12_4_ * auVar133._12_4_;
      auVar46._16_4_ = auVar140._16_4_ * auVar133._16_4_;
      auVar46._20_4_ = auVar140._20_4_ * auVar133._20_4_;
      auVar46._24_4_ = auVar140._24_4_ * auVar133._24_4_;
      auVar46._28_4_ = auVar131._28_4_;
      auVar47._4_4_ = auVar133._4_4_ * -auVar139._4_4_;
      auVar47._0_4_ = auVar133._0_4_ * -auVar139._0_4_;
      auVar47._8_4_ = auVar133._8_4_ * -auVar139._8_4_;
      auVar47._12_4_ = auVar133._12_4_ * -auVar139._12_4_;
      auVar47._16_4_ = auVar133._16_4_ * -fVar225;
      auVar47._20_4_ = auVar133._20_4_ * -fVar223;
      auVar47._24_4_ = auVar133._24_4_ * -fVar187;
      auVar47._28_4_ = uVar98 ^ 0x80000000;
      auVar131 = vmulps_avx512vl(auVar133,ZEXT1632(auVar115));
      auVar124 = ZEXT1632(auVar115);
      auVar132 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar124);
      auVar110 = vfmadd231ps_fma(auVar132,auVar142,auVar142);
      auVar132 = vrsqrt14ps_avx512vl(ZEXT1632(auVar110));
      fVar223 = auVar132._0_4_;
      fVar225 = auVar132._4_4_;
      fVar187 = auVar132._8_4_;
      fVar107 = auVar132._12_4_;
      fVar108 = auVar132._16_4_;
      fVar164 = auVar132._20_4_;
      fVar165 = auVar132._24_4_;
      auVar48._4_4_ = fVar225 * fVar225 * fVar225 * auVar110._4_4_ * -0.5;
      auVar48._0_4_ = fVar223 * fVar223 * fVar223 * auVar110._0_4_ * -0.5;
      auVar48._8_4_ = fVar187 * fVar187 * fVar187 * auVar110._8_4_ * -0.5;
      auVar48._12_4_ = fVar107 * fVar107 * fVar107 * auVar110._12_4_ * -0.5;
      auVar48._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar48._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar48._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
      auVar48._28_4_ = 0;
      auVar134 = vfmadd231ps_avx512vl(auVar48,auVar134,auVar132);
      auVar49._4_4_ = auVar142._4_4_ * auVar134._4_4_;
      auVar49._0_4_ = auVar142._0_4_ * auVar134._0_4_;
      auVar49._8_4_ = auVar142._8_4_ * auVar134._8_4_;
      auVar49._12_4_ = auVar142._12_4_ * auVar134._12_4_;
      auVar49._16_4_ = auVar142._16_4_ * auVar134._16_4_;
      auVar49._20_4_ = auVar142._20_4_ * auVar134._20_4_;
      auVar49._24_4_ = auVar142._24_4_ * auVar134._24_4_;
      auVar49._28_4_ = auVar132._28_4_;
      auVar50._4_4_ = -auVar141._4_4_ * auVar134._4_4_;
      auVar50._0_4_ = -auVar141._0_4_ * auVar134._0_4_;
      auVar50._8_4_ = -auVar141._8_4_ * auVar134._8_4_;
      auVar50._12_4_ = -auVar141._12_4_ * auVar134._12_4_;
      auVar50._16_4_ = -fVar199 * auVar134._16_4_;
      auVar50._20_4_ = -fVar190 * auVar134._20_4_;
      auVar50._24_4_ = -fVar198 * auVar134._24_4_;
      auVar50._28_4_ = auVar133._28_4_;
      auVar134 = vmulps_avx512vl(auVar134,auVar124);
      auVar110 = vfmadd213ps_fma(auVar46,auVar118,auVar136);
      auVar109 = vfmadd213ps_fma(auVar47,auVar118,auVar135);
      auVar133 = vfmadd213ps_avx512vl(auVar131,auVar118,auVar130);
      auVar132 = vfmadd213ps_avx512vl(auVar49,ZEXT1632(auVar233),ZEXT1632(auVar11));
      auVar111 = vfnmadd213ps_fma(auVar46,auVar118,auVar136);
      auVar123 = ZEXT1632(auVar233);
      auVar6 = vfmadd213ps_fma(auVar50,auVar123,ZEXT1632(auVar12));
      auVar113 = vfnmadd213ps_fma(auVar47,auVar118,auVar135);
      auVar8 = vfmadd213ps_fma(auVar134,auVar123,auVar129);
      auVar128 = vfnmadd231ps_avx512vl(auVar130,auVar118,auVar131);
      auVar11 = vfnmadd213ps_fma(auVar49,auVar123,ZEXT1632(auVar11));
      auVar12 = vfnmadd213ps_fma(auVar50,auVar123,ZEXT1632(auVar12));
      auVar114 = vfnmadd231ps_fma(auVar129,ZEXT1632(auVar233),auVar134);
      auVar134 = vsubps_avx512vl(auVar132,ZEXT1632(auVar111));
      auVar131 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar113));
      auVar129 = vsubps_avx512vl(ZEXT1632(auVar8),auVar128);
      auVar130 = vmulps_avx512vl(auVar131,auVar128);
      auVar9 = vfmsub231ps_fma(auVar130,ZEXT1632(auVar113),auVar129);
      auVar51._4_4_ = auVar111._4_4_ * auVar129._4_4_;
      auVar51._0_4_ = auVar111._0_4_ * auVar129._0_4_;
      auVar51._8_4_ = auVar111._8_4_ * auVar129._8_4_;
      auVar51._12_4_ = auVar111._12_4_ * auVar129._12_4_;
      auVar51._16_4_ = auVar129._16_4_ * 0.0;
      auVar51._20_4_ = auVar129._20_4_ * 0.0;
      auVar51._24_4_ = auVar129._24_4_ * 0.0;
      auVar51._28_4_ = auVar129._28_4_;
      auVar129 = vfmsub231ps_avx512vl(auVar51,auVar128,auVar134);
      auVar52._4_4_ = auVar113._4_4_ * auVar134._4_4_;
      auVar52._0_4_ = auVar113._0_4_ * auVar134._0_4_;
      auVar52._8_4_ = auVar113._8_4_ * auVar134._8_4_;
      auVar52._12_4_ = auVar113._12_4_ * auVar134._12_4_;
      auVar52._16_4_ = auVar134._16_4_ * 0.0;
      auVar52._20_4_ = auVar134._20_4_ * 0.0;
      auVar52._24_4_ = auVar134._24_4_ * 0.0;
      auVar52._28_4_ = auVar134._28_4_;
      auVar10 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar111),auVar131);
      auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar124,auVar129);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar124,ZEXT1632(auVar9));
      auVar137 = ZEXT1632(auVar115);
      uVar97 = vcmpps_avx512vl(auVar131,auVar137,2);
      bVar96 = (byte)uVar97;
      fVar107 = (float)((uint)(bVar96 & 1) * auVar110._0_4_ |
                       (uint)!(bool)(bVar96 & 1) * auVar11._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      fVar164 = (float)((uint)bVar20 * auVar110._4_4_ | (uint)!bVar20 * auVar11._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      fVar166 = (float)((uint)bVar20 * auVar110._8_4_ | (uint)!bVar20 * auVar11._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      fVar168 = (float)((uint)bVar20 * auVar110._12_4_ | (uint)!bVar20 * auVar11._12_4_);
      auVar130 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar166,CONCAT44(fVar164,fVar107))));
      fVar108 = (float)((uint)(bVar96 & 1) * auVar109._0_4_ |
                       (uint)!(bool)(bVar96 & 1) * auVar12._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      fVar165 = (float)((uint)bVar20 * auVar109._4_4_ | (uint)!bVar20 * auVar12._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      fVar167 = (float)((uint)bVar20 * auVar109._8_4_ | (uint)!bVar20 * auVar12._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      fVar169 = (float)((uint)bVar20 * auVar109._12_4_ | (uint)!bVar20 * auVar12._12_4_);
      auVar123 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar167,CONCAT44(fVar165,fVar108))));
      auVar143._0_4_ =
           (float)((uint)(bVar96 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar114._0_4_)
      ;
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar143._4_4_ = (float)((uint)bVar20 * auVar133._4_4_ | (uint)!bVar20 * auVar114._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar143._8_4_ = (float)((uint)bVar20 * auVar133._8_4_ | (uint)!bVar20 * auVar114._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar143._12_4_ = (float)((uint)bVar20 * auVar133._12_4_ | (uint)!bVar20 * auVar114._12_4_);
      fVar223 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar133._16_4_);
      auVar143._16_4_ = fVar223;
      fVar225 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar133._20_4_);
      auVar143._20_4_ = fVar225;
      fVar187 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar133._24_4_);
      auVar143._24_4_ = fVar187;
      iVar1 = (uint)(byte)(uVar97 >> 7) * auVar133._28_4_;
      auVar143._28_4_ = iVar1;
      auVar134 = vblendmps_avx512vl(ZEXT1632(auVar111),auVar132);
      auVar144._0_4_ =
           (uint)(bVar96 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar109._0_4_;
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar144._4_4_ = (uint)bVar20 * auVar134._4_4_ | (uint)!bVar20 * auVar109._4_4_;
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar144._8_4_ = (uint)bVar20 * auVar134._8_4_ | (uint)!bVar20 * auVar109._8_4_;
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar144._12_4_ = (uint)bVar20 * auVar134._12_4_ | (uint)!bVar20 * auVar109._12_4_;
      auVar144._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar134._16_4_;
      auVar144._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar134._20_4_;
      auVar144._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar134._24_4_;
      auVar144._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar134._28_4_;
      auVar134 = vblendmps_avx512vl(ZEXT1632(auVar113),ZEXT1632(auVar6));
      auVar145._0_4_ =
           (float)((uint)(bVar96 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar9._0_4_);
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar145._4_4_ = (float)((uint)bVar20 * auVar134._4_4_ | (uint)!bVar20 * auVar9._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar145._8_4_ = (float)((uint)bVar20 * auVar134._8_4_ | (uint)!bVar20 * auVar9._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar145._12_4_ = (float)((uint)bVar20 * auVar134._12_4_ | (uint)!bVar20 * auVar9._12_4_);
      fVar199 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar134._16_4_);
      auVar145._16_4_ = fVar199;
      fVar198 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar134._20_4_);
      auVar145._20_4_ = fVar198;
      fVar190 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar134._24_4_);
      auVar145._24_4_ = fVar190;
      auVar145._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar134._28_4_;
      auVar134 = vblendmps_avx512vl(auVar128,ZEXT1632(auVar8));
      auVar146._0_4_ =
           (float)((uint)(bVar96 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar133._0_4_)
      ;
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar146._4_4_ = (float)((uint)bVar20 * auVar134._4_4_ | (uint)!bVar20 * auVar133._4_4_);
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar146._8_4_ = (float)((uint)bVar20 * auVar134._8_4_ | (uint)!bVar20 * auVar133._8_4_);
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar146._12_4_ = (float)((uint)bVar20 * auVar134._12_4_ | (uint)!bVar20 * auVar133._12_4_);
      bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar146._16_4_ = (float)((uint)bVar20 * auVar134._16_4_ | (uint)!bVar20 * auVar133._16_4_);
      bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar146._20_4_ = (float)((uint)bVar20 * auVar134._20_4_ | (uint)!bVar20 * auVar133._20_4_);
      bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar146._24_4_ = (float)((uint)bVar20 * auVar134._24_4_ | (uint)!bVar20 * auVar133._24_4_);
      bVar20 = SUB81(uVar97 >> 7,0);
      auVar146._28_4_ = (uint)bVar20 * auVar134._28_4_ | (uint)!bVar20 * auVar133._28_4_;
      auVar147._0_4_ =
           (uint)(bVar96 & 1) * (int)auVar111._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar132._0_4_;
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar147._4_4_ = (uint)bVar20 * (int)auVar111._4_4_ | (uint)!bVar20 * auVar132._4_4_;
      bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar147._8_4_ = (uint)bVar20 * (int)auVar111._8_4_ | (uint)!bVar20 * auVar132._8_4_;
      bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar147._12_4_ = (uint)bVar20 * (int)auVar111._12_4_ | (uint)!bVar20 * auVar132._12_4_;
      auVar147._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
      auVar147._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
      auVar147._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
      auVar147._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar132._28_4_;
      bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
      bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
      bVar23 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar148._0_4_ =
           (uint)(bVar96 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar8._0_4_;
      bVar21 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar148._4_4_ = (uint)bVar21 * auVar128._4_4_ | (uint)!bVar21 * auVar8._4_4_;
      bVar21 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar148._8_4_ = (uint)bVar21 * auVar128._8_4_ | (uint)!bVar21 * auVar8._8_4_;
      bVar21 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar148._12_4_ = (uint)bVar21 * auVar128._12_4_ | (uint)!bVar21 * auVar8._12_4_;
      auVar148._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar128._16_4_;
      auVar148._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar128._20_4_;
      auVar148._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar128._24_4_;
      iVar2 = (uint)(byte)(uVar97 >> 7) * auVar128._28_4_;
      auVar148._28_4_ = iVar2;
      auVar124 = vsubps_avx512vl(auVar147,auVar130);
      auVar134 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar113._12_4_ |
                                               (uint)!bVar23 * auVar6._12_4_,
                                               CONCAT48((uint)bVar22 * (int)auVar113._8_4_ |
                                                        (uint)!bVar22 * auVar6._8_4_,
                                                        CONCAT44((uint)bVar20 * (int)auVar113._4_4_
                                                                 | (uint)!bVar20 * auVar6._4_4_,
                                                                 (uint)(bVar96 & 1) *
                                                                 (int)auVar113._0_4_ |
                                                                 (uint)!(bool)(bVar96 & 1) *
                                                                 auVar6._0_4_)))),auVar123);
      auVar219 = ZEXT3264(auVar134);
      auVar133 = vsubps_avx(auVar148,auVar143);
      auVar132 = vsubps_avx(auVar130,auVar144);
      auVar221 = ZEXT3264(auVar132);
      auVar128 = vsubps_avx(auVar123,auVar145);
      auVar129 = vsubps_avx(auVar143,auVar146);
      auVar53._4_4_ = auVar133._4_4_ * fVar164;
      auVar53._0_4_ = auVar133._0_4_ * fVar107;
      auVar53._8_4_ = auVar133._8_4_ * fVar166;
      auVar53._12_4_ = auVar133._12_4_ * fVar168;
      auVar53._16_4_ = auVar133._16_4_ * 0.0;
      auVar53._20_4_ = auVar133._20_4_ * 0.0;
      auVar53._24_4_ = auVar133._24_4_ * 0.0;
      auVar53._28_4_ = iVar2;
      auVar110 = vfmsub231ps_fma(auVar53,auVar143,auVar124);
      auVar54._4_4_ = fVar165 * auVar124._4_4_;
      auVar54._0_4_ = fVar108 * auVar124._0_4_;
      auVar54._8_4_ = fVar167 * auVar124._8_4_;
      auVar54._12_4_ = fVar169 * auVar124._12_4_;
      auVar54._16_4_ = auVar124._16_4_ * 0.0;
      auVar54._20_4_ = auVar124._20_4_ * 0.0;
      auVar54._24_4_ = auVar124._24_4_ * 0.0;
      auVar54._28_4_ = auVar131._28_4_;
      auVar109 = vfmsub231ps_fma(auVar54,auVar130,auVar134);
      auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar137,ZEXT1632(auVar110));
      auVar210._0_4_ = auVar134._0_4_ * auVar143._0_4_;
      auVar210._4_4_ = auVar134._4_4_ * auVar143._4_4_;
      auVar210._8_4_ = auVar134._8_4_ * auVar143._8_4_;
      auVar210._12_4_ = auVar134._12_4_ * auVar143._12_4_;
      auVar210._16_4_ = auVar134._16_4_ * fVar223;
      auVar210._20_4_ = auVar134._20_4_ * fVar225;
      auVar210._24_4_ = auVar134._24_4_ * fVar187;
      auVar210._28_4_ = 0;
      auVar110 = vfmsub231ps_fma(auVar210,auVar123,auVar133);
      auVar135 = vfmadd231ps_avx512vl(auVar131,auVar137,ZEXT1632(auVar110));
      auVar131 = vmulps_avx512vl(auVar129,auVar144);
      auVar131 = vfmsub231ps_avx512vl(auVar131,auVar132,auVar146);
      auVar55._4_4_ = auVar128._4_4_ * auVar146._4_4_;
      auVar55._0_4_ = auVar128._0_4_ * auVar146._0_4_;
      auVar55._8_4_ = auVar128._8_4_ * auVar146._8_4_;
      auVar55._12_4_ = auVar128._12_4_ * auVar146._12_4_;
      auVar55._16_4_ = auVar128._16_4_ * auVar146._16_4_;
      auVar55._20_4_ = auVar128._20_4_ * auVar146._20_4_;
      auVar55._24_4_ = auVar128._24_4_ * auVar146._24_4_;
      auVar55._28_4_ = auVar146._28_4_;
      auVar110 = vfmsub231ps_fma(auVar55,auVar145,auVar129);
      auVar211._0_4_ = auVar145._0_4_ * auVar132._0_4_;
      auVar211._4_4_ = auVar145._4_4_ * auVar132._4_4_;
      auVar211._8_4_ = auVar145._8_4_ * auVar132._8_4_;
      auVar211._12_4_ = auVar145._12_4_ * auVar132._12_4_;
      auVar211._16_4_ = fVar199 * auVar132._16_4_;
      auVar211._20_4_ = fVar198 * auVar132._20_4_;
      auVar211._24_4_ = fVar190 * auVar132._24_4_;
      auVar211._28_4_ = 0;
      auVar109 = vfmsub231ps_fma(auVar211,auVar128,auVar144);
      auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar137,auVar131);
      auVar136 = vfmadd231ps_avx512vl(auVar131,auVar137,ZEXT1632(auVar110));
      auVar214 = ZEXT3264(auVar136);
      auVar131 = vmaxps_avx(auVar135,auVar136);
      uVar188 = vcmpps_avx512vl(auVar131,auVar137,2);
      bVar105 = bVar105 & (byte)uVar188;
      if (bVar105 != 0) {
        auVar56._4_4_ = auVar129._4_4_ * auVar134._4_4_;
        auVar56._0_4_ = auVar129._0_4_ * auVar134._0_4_;
        auVar56._8_4_ = auVar129._8_4_ * auVar134._8_4_;
        auVar56._12_4_ = auVar129._12_4_ * auVar134._12_4_;
        auVar56._16_4_ = auVar129._16_4_ * auVar134._16_4_;
        auVar56._20_4_ = auVar129._20_4_ * auVar134._20_4_;
        auVar56._24_4_ = auVar129._24_4_ * auVar134._24_4_;
        auVar56._28_4_ = auVar131._28_4_;
        auVar8 = vfmsub231ps_fma(auVar56,auVar128,auVar133);
        auVar57._4_4_ = auVar133._4_4_ * auVar132._4_4_;
        auVar57._0_4_ = auVar133._0_4_ * auVar132._0_4_;
        auVar57._8_4_ = auVar133._8_4_ * auVar132._8_4_;
        auVar57._12_4_ = auVar133._12_4_ * auVar132._12_4_;
        auVar57._16_4_ = auVar133._16_4_ * auVar132._16_4_;
        auVar57._20_4_ = auVar133._20_4_ * auVar132._20_4_;
        auVar57._24_4_ = auVar133._24_4_ * auVar132._24_4_;
        auVar57._28_4_ = auVar133._28_4_;
        auVar6 = vfmsub231ps_fma(auVar57,auVar124,auVar129);
        auVar58._4_4_ = auVar128._4_4_ * auVar124._4_4_;
        auVar58._0_4_ = auVar128._0_4_ * auVar124._0_4_;
        auVar58._8_4_ = auVar128._8_4_ * auVar124._8_4_;
        auVar58._12_4_ = auVar128._12_4_ * auVar124._12_4_;
        auVar58._16_4_ = auVar128._16_4_ * auVar124._16_4_;
        auVar58._20_4_ = auVar128._20_4_ * auVar124._20_4_;
        auVar58._24_4_ = auVar128._24_4_ * auVar124._24_4_;
        auVar58._28_4_ = auVar128._28_4_;
        auVar9 = vfmsub231ps_fma(auVar58,auVar132,auVar134);
        auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
        auVar109 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20)
        ;
        auVar131 = vrcp14ps_avx512vl(ZEXT1632(auVar109));
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        auVar38._16_4_ = 0x3f800000;
        auVar38._20_4_ = 0x3f800000;
        auVar38._24_4_ = 0x3f800000;
        auVar38._28_4_ = 0x3f800000;
        auVar134 = vfnmadd213ps_avx512vl(auVar131,ZEXT1632(auVar109),auVar38);
        auVar110 = vfmadd132ps_fma(auVar134,auVar131,auVar131);
        auVar219 = ZEXT1664(auVar110);
        auVar59._4_4_ = auVar9._4_4_ * auVar143._4_4_;
        auVar59._0_4_ = auVar9._0_4_ * auVar143._0_4_;
        auVar59._8_4_ = auVar9._8_4_ * auVar143._8_4_;
        auVar59._12_4_ = auVar9._12_4_ * auVar143._12_4_;
        auVar59._16_4_ = fVar223 * 0.0;
        auVar59._20_4_ = fVar225 * 0.0;
        auVar59._24_4_ = fVar187 * 0.0;
        auVar59._28_4_ = iVar1;
        auVar6 = vfmadd231ps_fma(auVar59,auVar123,ZEXT1632(auVar6));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar130,ZEXT1632(auVar8));
        fVar223 = auVar110._0_4_;
        fVar225 = auVar110._4_4_;
        fVar187 = auVar110._8_4_;
        fVar199 = auVar110._12_4_;
        local_5c0._28_4_ = auVar131._28_4_;
        local_5c0._0_28_ =
             ZEXT1628(CONCAT412(auVar6._12_4_ * fVar199,
                                CONCAT48(auVar6._8_4_ * fVar187,
                                         CONCAT44(auVar6._4_4_ * fVar225,auVar6._0_4_ * fVar223))));
        auVar221 = ZEXT3264(local_5c0);
        auVar177._4_4_ = local_760;
        auVar177._0_4_ = local_760;
        auVar177._8_4_ = local_760;
        auVar177._12_4_ = local_760;
        auVar177._16_4_ = local_760;
        auVar177._20_4_ = local_760;
        auVar177._24_4_ = local_760;
        auVar177._28_4_ = local_760;
        uVar188 = vcmpps_avx512vl(auVar177,local_5c0,2);
        uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar39._4_4_ = uVar186;
        auVar39._0_4_ = uVar186;
        auVar39._8_4_ = uVar186;
        auVar39._12_4_ = uVar186;
        auVar39._16_4_ = uVar186;
        auVar39._20_4_ = uVar186;
        auVar39._24_4_ = uVar186;
        auVar39._28_4_ = uVar186;
        uVar36 = vcmpps_avx512vl(local_5c0,auVar39,2);
        bVar105 = (byte)uVar188 & (byte)uVar36 & bVar105;
        if (bVar105 != 0) {
          uVar106 = vcmpps_avx512vl(ZEXT1632(auVar109),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar106 = bVar105 & uVar106;
          if ((char)uVar106 != '\0') {
            fVar190 = auVar135._0_4_ * fVar223;
            fVar198 = auVar135._4_4_ * fVar225;
            auVar60._4_4_ = fVar198;
            auVar60._0_4_ = fVar190;
            fVar107 = auVar135._8_4_ * fVar187;
            auVar60._8_4_ = fVar107;
            fVar108 = auVar135._12_4_ * fVar199;
            auVar60._12_4_ = fVar108;
            fVar164 = auVar135._16_4_ * 0.0;
            auVar60._16_4_ = fVar164;
            fVar165 = auVar135._20_4_ * 0.0;
            auVar60._20_4_ = fVar165;
            fVar166 = auVar135._24_4_ * 0.0;
            auVar60._24_4_ = fVar166;
            auVar60._28_4_ = auVar135._28_4_;
            auVar178._8_4_ = 0x3f800000;
            auVar178._0_8_ = 0x3f8000003f800000;
            auVar178._12_4_ = 0x3f800000;
            auVar178._16_4_ = 0x3f800000;
            auVar178._20_4_ = 0x3f800000;
            auVar178._24_4_ = 0x3f800000;
            auVar178._28_4_ = 0x3f800000;
            auVar131 = vsubps_avx(auVar178,auVar60);
            local_600._0_4_ =
                 (float)((uint)(bVar96 & 1) * (int)fVar190 |
                        (uint)!(bool)(bVar96 & 1) * auVar131._0_4_);
            bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
            local_600._4_4_ = (float)((uint)bVar20 * (int)fVar198 | (uint)!bVar20 * auVar131._4_4_);
            bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
            local_600._8_4_ = (float)((uint)bVar20 * (int)fVar107 | (uint)!bVar20 * auVar131._8_4_);
            bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
            local_600._12_4_ =
                 (float)((uint)bVar20 * (int)fVar108 | (uint)!bVar20 * auVar131._12_4_);
            bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
            local_600._16_4_ =
                 (float)((uint)bVar20 * (int)fVar164 | (uint)!bVar20 * auVar131._16_4_);
            bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
            local_600._20_4_ =
                 (float)((uint)bVar20 * (int)fVar165 | (uint)!bVar20 * auVar131._20_4_);
            bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
            local_600._24_4_ =
                 (float)((uint)bVar20 * (int)fVar166 | (uint)!bVar20 * auVar131._24_4_);
            bVar20 = SUB81(uVar97 >> 7,0);
            local_600._28_4_ =
                 (float)((uint)bVar20 * auVar135._28_4_ | (uint)!bVar20 * auVar131._28_4_);
            auVar131 = vsubps_avx(ZEXT1632(auVar233),auVar118);
            auVar110 = vfmadd213ps_fma(auVar131,local_600,auVar118);
            uVar186 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
            auVar118._4_4_ = uVar186;
            auVar118._0_4_ = uVar186;
            auVar118._8_4_ = uVar186;
            auVar118._12_4_ = uVar186;
            auVar118._16_4_ = uVar186;
            auVar118._20_4_ = uVar186;
            auVar118._24_4_ = uVar186;
            auVar118._28_4_ = uVar186;
            auVar131 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar110._12_4_ + auVar110._12_4_,
                                                          CONCAT48(auVar110._8_4_ + auVar110._8_4_,
                                                                   CONCAT44(auVar110._4_4_ +
                                                                            auVar110._4_4_,
                                                                            auVar110._0_4_ +
                                                                            auVar110._0_4_)))),
                                       auVar118);
            uVar35 = vcmpps_avx512vl(local_5c0,auVar131,6);
            uVar106 = uVar106 & uVar35;
            bVar105 = (byte)uVar106;
            if (bVar105 != 0) {
              auVar196._0_4_ = auVar136._0_4_ * fVar223;
              auVar196._4_4_ = auVar136._4_4_ * fVar225;
              auVar196._8_4_ = auVar136._8_4_ * fVar187;
              auVar196._12_4_ = auVar136._12_4_ * fVar199;
              auVar196._16_4_ = auVar136._16_4_ * 0.0;
              auVar196._20_4_ = auVar136._20_4_ * 0.0;
              auVar196._24_4_ = auVar136._24_4_ * 0.0;
              auVar196._28_4_ = 0;
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = 0x3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar131 = vsubps_avx(auVar206,auVar196);
              auVar149._0_4_ =
                   (uint)(bVar96 & 1) * (int)auVar196._0_4_ |
                   (uint)!(bool)(bVar96 & 1) * auVar131._0_4_;
              bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
              auVar149._4_4_ = (uint)bVar20 * (int)auVar196._4_4_ | (uint)!bVar20 * auVar131._4_4_;
              bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
              auVar149._8_4_ = (uint)bVar20 * (int)auVar196._8_4_ | (uint)!bVar20 * auVar131._8_4_;
              bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
              auVar149._12_4_ =
                   (uint)bVar20 * (int)auVar196._12_4_ | (uint)!bVar20 * auVar131._12_4_;
              bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
              auVar149._16_4_ =
                   (uint)bVar20 * (int)auVar196._16_4_ | (uint)!bVar20 * auVar131._16_4_;
              bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
              auVar149._20_4_ =
                   (uint)bVar20 * (int)auVar196._20_4_ | (uint)!bVar20 * auVar131._20_4_;
              bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
              auVar149._24_4_ =
                   (uint)bVar20 * (int)auVar196._24_4_ | (uint)!bVar20 * auVar131._24_4_;
              auVar149._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar131._28_4_;
              auVar40._8_4_ = 0x40000000;
              auVar40._0_8_ = 0x4000000040000000;
              auVar40._12_4_ = 0x40000000;
              auVar40._16_4_ = 0x40000000;
              auVar40._20_4_ = 0x40000000;
              auVar40._24_4_ = 0x40000000;
              auVar40._28_4_ = 0x40000000;
              local_5e0 = vfmsub132ps_avx512vl(auVar149,auVar206,auVar40);
              local_5a0 = 0;
              local_590 = local_840;
              uStack_588 = uStack_838;
              local_580 = local_860;
              uStack_578 = uStack_858;
              local_570 = local_870;
              uStack_568 = uStack_868;
              local_560 = local_850;
              uStack_558 = uStack_848;
              if ((pGVar102->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar191 = 1.0 / auVar117._0_4_;
                local_540[0] = fVar191 * (local_600._0_4_ + 0.0);
                local_540[1] = fVar191 * (local_600._4_4_ + 1.0);
                local_540[2] = fVar191 * (local_600._8_4_ + 2.0);
                local_540[3] = fVar191 * (local_600._12_4_ + 3.0);
                fStack_530 = fVar191 * (local_600._16_4_ + 4.0);
                fStack_52c = fVar191 * (local_600._20_4_ + 5.0);
                fStack_528 = fVar191 * (local_600._24_4_ + 6.0);
                fStack_524 = local_600._28_4_ + 7.0;
                local_520 = local_5e0;
                local_500 = local_5c0;
                auVar179._8_4_ = 0x7f800000;
                auVar179._0_8_ = 0x7f8000007f800000;
                auVar179._12_4_ = 0x7f800000;
                auVar179._16_4_ = 0x7f800000;
                auVar179._20_4_ = 0x7f800000;
                auVar179._24_4_ = 0x7f800000;
                auVar179._28_4_ = 0x7f800000;
                auVar131 = vblendmps_avx512vl(auVar179,local_5c0);
                auVar150._0_4_ =
                     (uint)(bVar105 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar105 & 1) * 0x7f800000;
                bVar20 = (bool)((byte)(uVar106 >> 1) & 1);
                auVar150._4_4_ = (uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar106 >> 2) & 1);
                auVar150._8_4_ = (uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                auVar150._12_4_ = (uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar106 >> 4) & 1);
                auVar150._16_4_ = (uint)bVar20 * auVar131._16_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar106 >> 5) & 1);
                auVar150._20_4_ = (uint)bVar20 * auVar131._20_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar106 >> 6) & 1);
                auVar150._24_4_ = (uint)bVar20 * auVar131._24_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = SUB81(uVar106 >> 7,0);
                auVar150._28_4_ = (uint)bVar20 * auVar131._28_4_ | (uint)!bVar20 * 0x7f800000;
                auVar131 = vshufps_avx(auVar150,auVar150,0xb1);
                auVar131 = vminps_avx(auVar150,auVar131);
                auVar134 = vshufpd_avx(auVar131,auVar131,5);
                auVar131 = vminps_avx(auVar131,auVar134);
                auVar134 = vpermpd_avx2(auVar131,0x4e);
                auVar131 = vminps_avx(auVar131,auVar134);
                uVar188 = vcmpps_avx512vl(auVar150,auVar131,0);
                uVar98 = (uint)uVar106;
                if ((bVar105 & (byte)uVar188) != 0) {
                  uVar98 = (uint)(bVar105 & (byte)uVar188);
                }
                uVar37 = 0;
                for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                  uVar37 = uVar37 + 1;
                }
                uVar97 = (ulong)uVar37;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar102->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780 = *(float *)(ray + k * 4 + 0x200);
                  fStack_77c = 0.0;
                  fStack_778 = 0.0;
                  fStack_774 = 0.0;
                  local_7c0 = local_5c0;
                  local_59c = iVar14;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar97]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar97 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_500 + uVar97 * 4);
                    local_830.context = context->user;
                    fVar187 = local_200._0_4_;
                    fVar223 = 1.0 - fVar187;
                    fVar191 = fVar223 * fVar223 * -3.0;
                    auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223)),
                                               ZEXT416((uint)(fVar187 * fVar223)),
                                               ZEXT416(0xc0000000));
                    auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar223)),
                                               ZEXT416((uint)(fVar187 * fVar187)),
                                               ZEXT416(0x40000000));
                    fVar223 = auVar110._0_4_ * 3.0;
                    fVar225 = auVar109._0_4_ * 3.0;
                    fVar187 = fVar187 * fVar187 * 3.0;
                    auVar218._0_4_ = fVar187 * fVar34;
                    auVar218._4_4_ = fVar187 * fVar78;
                    auVar218._8_4_ = fVar187 * fVar79;
                    auVar218._12_4_ = fVar187 * fVar95;
                    auVar175._4_4_ = fVar225;
                    auVar175._0_4_ = fVar225;
                    auVar175._8_4_ = fVar225;
                    auVar175._12_4_ = fVar225;
                    auVar110 = vfmadd132ps_fma(auVar175,auVar218,auVar112);
                    auVar205._4_4_ = fVar223;
                    auVar205._0_4_ = fVar223;
                    auVar205._8_4_ = fVar223;
                    auVar205._12_4_ = fVar223;
                    auVar110 = vfmadd132ps_fma(auVar205,auVar110,auVar172);
                    auVar176._4_4_ = fVar191;
                    auVar176._0_4_ = fVar191;
                    auVar176._8_4_ = fVar191;
                    auVar176._12_4_ = fVar191;
                    auVar110 = vfmadd132ps_fma(auVar176,auVar110,auVar7);
                    auVar185 = vbroadcastss_avx512f(auVar110);
                    auVar214 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar214 = vpermps_avx512f(auVar214,ZEXT1664(auVar110));
                    auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar110));
                    local_2c0[0] = (RTCHitN)auVar185[0];
                    local_2c0[1] = (RTCHitN)auVar185[1];
                    local_2c0[2] = (RTCHitN)auVar185[2];
                    local_2c0[3] = (RTCHitN)auVar185[3];
                    local_2c0[4] = (RTCHitN)auVar185[4];
                    local_2c0[5] = (RTCHitN)auVar185[5];
                    local_2c0[6] = (RTCHitN)auVar185[6];
                    local_2c0[7] = (RTCHitN)auVar185[7];
                    local_2c0[8] = (RTCHitN)auVar185[8];
                    local_2c0[9] = (RTCHitN)auVar185[9];
                    local_2c0[10] = (RTCHitN)auVar185[10];
                    local_2c0[0xb] = (RTCHitN)auVar185[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar185[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar185[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar185[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar185[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar185[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar185[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar185[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar185[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar185[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar185[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar185[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar185[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar185[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar185[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar185[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar185[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar185[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar185[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar185[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar185[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar185[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar185[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar185[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar185[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar185[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar185[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar185[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar185[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar185[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar185[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar185[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar185[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar185[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar185[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar185[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar185[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar185[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar185[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar185[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar185[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar185[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar185[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar185[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar185[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar185[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar185[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar185[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar185[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar185[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar185[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar185[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar185[0x3f];
                    local_280 = auVar214;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar185 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar185);
                    auVar131 = vpcmpeqd_avx2(auVar185._0_32_,auVar185._0_32_);
                    local_7e8[3] = auVar131;
                    local_7e8[2] = auVar131;
                    local_7e8[1] = auVar131;
                    *local_7e8 = auVar131;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                    auVar185 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar185);
                    local_830.valid = (int *)local_740;
                    local_830.geometryUserPtr = pGVar102->userPtr;
                    local_830.hit = local_2c0;
                    local_830.N = 0x10;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar102->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar214 = ZEXT1664(auVar214._0_16_);
                      auVar219 = ZEXT1664(auVar219._0_16_);
                      (*pGVar102->intersectionFilterN)(&local_830);
                      auVar221 = ZEXT3264(local_7c0);
                      auVar131 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar236 = ZEXT3264(auVar131);
                      auVar131 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar237 = ZEXT3264(auVar131);
                      auVar185 = vmovdqa64_avx512f(local_740);
                    }
                    uVar188 = vptestmd_avx512f(auVar185,auVar185);
                    if ((short)uVar188 == 0) {
LAB_01b7d4f6:
                      *(float *)(ray + k * 4 + 0x200) = local_780;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar102->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        (*p_Var19)(&local_830);
                        auVar221 = ZEXT3264(local_7c0);
                        auVar131 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar236 = ZEXT3264(auVar131);
                        auVar131 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar237 = ZEXT3264(auVar131);
                        auVar185 = vmovdqa64_avx512f(local_740);
                      }
                      uVar35 = vptestmd_avx512f(auVar185,auVar185);
                      if ((short)uVar35 == 0) goto LAB_01b7d4f6;
                      iVar1 = *(int *)(local_830.hit + 4);
                      iVar2 = *(int *)(local_830.hit + 8);
                      iVar80 = *(int *)(local_830.hit + 0xc);
                      iVar81 = *(int *)(local_830.hit + 0x10);
                      iVar82 = *(int *)(local_830.hit + 0x14);
                      iVar83 = *(int *)(local_830.hit + 0x18);
                      iVar84 = *(int *)(local_830.hit + 0x1c);
                      iVar85 = *(int *)(local_830.hit + 0x20);
                      iVar86 = *(int *)(local_830.hit + 0x24);
                      iVar87 = *(int *)(local_830.hit + 0x28);
                      iVar88 = *(int *)(local_830.hit + 0x2c);
                      iVar89 = *(int *)(local_830.hit + 0x30);
                      iVar90 = *(int *)(local_830.hit + 0x34);
                      iVar91 = *(int *)(local_830.hit + 0x38);
                      iVar92 = *(int *)(local_830.hit + 0x3c);
                      bVar105 = (byte)uVar35;
                      bVar20 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar26 = (bool)((byte)(uVar35 >> 7) & 1);
                      bVar96 = (byte)(uVar35 >> 8);
                      bVar27 = (bool)((byte)(uVar35 >> 9) & 1);
                      bVar28 = (bool)((byte)(uVar35 >> 10) & 1);
                      bVar29 = (bool)((byte)(uVar35 >> 0xb) & 1);
                      bVar30 = (bool)((byte)(uVar35 >> 0xc) & 1);
                      bVar31 = (bool)((byte)(uVar35 >> 0xd) & 1);
                      bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                      bVar33 = SUB81(uVar35 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x300) =
                           (uint)(bVar105 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x300);
                      *(uint *)(local_830.ray + 0x304) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_830.ray + 0x304);
                      *(uint *)(local_830.ray + 0x308) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_830.ray + 0x308);
                      *(uint *)(local_830.ray + 0x30c) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x30c);
                      *(uint *)(local_830.ray + 0x310) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x310);
                      *(uint *)(local_830.ray + 0x314) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x314);
                      *(uint *)(local_830.ray + 0x318) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x318);
                      *(uint *)(local_830.ray + 0x31c) =
                           (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x31c);
                      *(uint *)(local_830.ray + 800) =
                           (uint)(bVar96 & 1) * iVar85 |
                           (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 800);
                      *(uint *)(local_830.ray + 0x324) =
                           (uint)bVar27 * iVar86 | (uint)!bVar27 * *(int *)(local_830.ray + 0x324);
                      *(uint *)(local_830.ray + 0x328) =
                           (uint)bVar28 * iVar87 | (uint)!bVar28 * *(int *)(local_830.ray + 0x328);
                      *(uint *)(local_830.ray + 0x32c) =
                           (uint)bVar29 * iVar88 | (uint)!bVar29 * *(int *)(local_830.ray + 0x32c);
                      *(uint *)(local_830.ray + 0x330) =
                           (uint)bVar30 * iVar89 | (uint)!bVar30 * *(int *)(local_830.ray + 0x330);
                      *(uint *)(local_830.ray + 0x334) =
                           (uint)bVar31 * iVar90 | (uint)!bVar31 * *(int *)(local_830.ray + 0x334);
                      *(uint *)(local_830.ray + 0x338) =
                           (uint)bVar32 * iVar91 | (uint)!bVar32 * *(int *)(local_830.ray + 0x338);
                      *(uint *)(local_830.ray + 0x33c) =
                           (uint)bVar33 * iVar92 | (uint)!bVar33 * *(int *)(local_830.ray + 0x33c);
                      iVar1 = *(int *)(local_830.hit + 0x44);
                      iVar2 = *(int *)(local_830.hit + 0x48);
                      iVar80 = *(int *)(local_830.hit + 0x4c);
                      iVar81 = *(int *)(local_830.hit + 0x50);
                      iVar82 = *(int *)(local_830.hit + 0x54);
                      iVar83 = *(int *)(local_830.hit + 0x58);
                      iVar84 = *(int *)(local_830.hit + 0x5c);
                      iVar85 = *(int *)(local_830.hit + 0x60);
                      iVar86 = *(int *)(local_830.hit + 100);
                      iVar87 = *(int *)(local_830.hit + 0x68);
                      iVar88 = *(int *)(local_830.hit + 0x6c);
                      iVar89 = *(int *)(local_830.hit + 0x70);
                      iVar90 = *(int *)(local_830.hit + 0x74);
                      iVar91 = *(int *)(local_830.hit + 0x78);
                      iVar92 = *(int *)(local_830.hit + 0x7c);
                      bVar20 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar26 = (bool)((byte)(uVar35 >> 7) & 1);
                      bVar27 = (bool)((byte)(uVar35 >> 9) & 1);
                      bVar28 = (bool)((byte)(uVar35 >> 10) & 1);
                      bVar29 = (bool)((byte)(uVar35 >> 0xb) & 1);
                      bVar30 = (bool)((byte)(uVar35 >> 0xc) & 1);
                      bVar31 = (bool)((byte)(uVar35 >> 0xd) & 1);
                      bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                      bVar33 = SUB81(uVar35 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x340) =
                           (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x340);
                      *(uint *)(local_830.ray + 0x344) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_830.ray + 0x344);
                      *(uint *)(local_830.ray + 0x348) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_830.ray + 0x348);
                      *(uint *)(local_830.ray + 0x34c) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x34c);
                      *(uint *)(local_830.ray + 0x350) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x350);
                      *(uint *)(local_830.ray + 0x354) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x354);
                      *(uint *)(local_830.ray + 0x358) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x358);
                      *(uint *)(local_830.ray + 0x35c) =
                           (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x35c);
                      *(uint *)(local_830.ray + 0x360) =
                           (uint)(bVar96 & 1) * iVar85 |
                           (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x360);
                      *(uint *)(local_830.ray + 0x364) =
                           (uint)bVar27 * iVar86 | (uint)!bVar27 * *(int *)(local_830.ray + 0x364);
                      *(uint *)(local_830.ray + 0x368) =
                           (uint)bVar28 * iVar87 | (uint)!bVar28 * *(int *)(local_830.ray + 0x368);
                      *(uint *)(local_830.ray + 0x36c) =
                           (uint)bVar29 * iVar88 | (uint)!bVar29 * *(int *)(local_830.ray + 0x36c);
                      *(uint *)(local_830.ray + 0x370) =
                           (uint)bVar30 * iVar89 | (uint)!bVar30 * *(int *)(local_830.ray + 0x370);
                      *(uint *)(local_830.ray + 0x374) =
                           (uint)bVar31 * iVar90 | (uint)!bVar31 * *(int *)(local_830.ray + 0x374);
                      *(uint *)(local_830.ray + 0x378) =
                           (uint)bVar32 * iVar91 | (uint)!bVar32 * *(int *)(local_830.ray + 0x378);
                      *(uint *)(local_830.ray + 0x37c) =
                           (uint)bVar33 * iVar92 | (uint)!bVar33 * *(int *)(local_830.ray + 0x37c);
                      iVar1 = *(int *)(local_830.hit + 0x84);
                      iVar2 = *(int *)(local_830.hit + 0x88);
                      iVar80 = *(int *)(local_830.hit + 0x8c);
                      iVar81 = *(int *)(local_830.hit + 0x90);
                      iVar82 = *(int *)(local_830.hit + 0x94);
                      iVar83 = *(int *)(local_830.hit + 0x98);
                      iVar84 = *(int *)(local_830.hit + 0x9c);
                      iVar85 = *(int *)(local_830.hit + 0xa0);
                      iVar86 = *(int *)(local_830.hit + 0xa4);
                      iVar87 = *(int *)(local_830.hit + 0xa8);
                      iVar88 = *(int *)(local_830.hit + 0xac);
                      iVar89 = *(int *)(local_830.hit + 0xb0);
                      iVar90 = *(int *)(local_830.hit + 0xb4);
                      iVar91 = *(int *)(local_830.hit + 0xb8);
                      iVar92 = *(int *)(local_830.hit + 0xbc);
                      bVar20 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar26 = (bool)((byte)(uVar35 >> 7) & 1);
                      bVar27 = (bool)((byte)(uVar35 >> 9) & 1);
                      bVar28 = (bool)((byte)(uVar35 >> 10) & 1);
                      bVar29 = (bool)((byte)(uVar35 >> 0xb) & 1);
                      bVar30 = (bool)((byte)(uVar35 >> 0xc) & 1);
                      bVar31 = (bool)((byte)(uVar35 >> 0xd) & 1);
                      bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                      bVar33 = SUB81(uVar35 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x380) =
                           (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0x80) |
                           (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x380);
                      *(uint *)(local_830.ray + 900) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_830.ray + 900);
                      *(uint *)(local_830.ray + 0x388) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_830.ray + 0x388);
                      *(uint *)(local_830.ray + 0x38c) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x38c);
                      *(uint *)(local_830.ray + 0x390) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x390);
                      *(uint *)(local_830.ray + 0x394) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x394);
                      *(uint *)(local_830.ray + 0x398) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x398);
                      *(uint *)(local_830.ray + 0x39c) =
                           (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x39c);
                      *(uint *)(local_830.ray + 0x3a0) =
                           (uint)(bVar96 & 1) * iVar85 |
                           (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x3a0);
                      *(uint *)(local_830.ray + 0x3a4) =
                           (uint)bVar27 * iVar86 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3a4);
                      *(uint *)(local_830.ray + 0x3a8) =
                           (uint)bVar28 * iVar87 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3a8);
                      *(uint *)(local_830.ray + 0x3ac) =
                           (uint)bVar29 * iVar88 | (uint)!bVar29 * *(int *)(local_830.ray + 0x3ac);
                      *(uint *)(local_830.ray + 0x3b0) =
                           (uint)bVar30 * iVar89 | (uint)!bVar30 * *(int *)(local_830.ray + 0x3b0);
                      *(uint *)(local_830.ray + 0x3b4) =
                           (uint)bVar31 * iVar90 | (uint)!bVar31 * *(int *)(local_830.ray + 0x3b4);
                      *(uint *)(local_830.ray + 0x3b8) =
                           (uint)bVar32 * iVar91 | (uint)!bVar32 * *(int *)(local_830.ray + 0x3b8);
                      *(uint *)(local_830.ray + 0x3bc) =
                           (uint)bVar33 * iVar92 | (uint)!bVar33 * *(int *)(local_830.ray + 0x3bc);
                      iVar1 = *(int *)(local_830.hit + 0xc4);
                      iVar2 = *(int *)(local_830.hit + 200);
                      iVar80 = *(int *)(local_830.hit + 0xcc);
                      iVar81 = *(int *)(local_830.hit + 0xd0);
                      iVar82 = *(int *)(local_830.hit + 0xd4);
                      iVar83 = *(int *)(local_830.hit + 0xd8);
                      iVar84 = *(int *)(local_830.hit + 0xdc);
                      iVar85 = *(int *)(local_830.hit + 0xe0);
                      iVar86 = *(int *)(local_830.hit + 0xe4);
                      iVar87 = *(int *)(local_830.hit + 0xe8);
                      iVar88 = *(int *)(local_830.hit + 0xec);
                      iVar89 = *(int *)(local_830.hit + 0xf0);
                      iVar90 = *(int *)(local_830.hit + 0xf4);
                      iVar91 = *(int *)(local_830.hit + 0xf8);
                      iVar92 = *(int *)(local_830.hit + 0xfc);
                      bVar20 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar26 = (bool)((byte)(uVar35 >> 7) & 1);
                      bVar27 = (bool)((byte)(uVar35 >> 9) & 1);
                      bVar28 = (bool)((byte)(uVar35 >> 10) & 1);
                      bVar29 = (bool)((byte)(uVar35 >> 0xb) & 1);
                      bVar30 = (bool)((byte)(uVar35 >> 0xc) & 1);
                      bVar31 = (bool)((byte)(uVar35 >> 0xd) & 1);
                      bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                      bVar33 = SUB81(uVar35 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x3c0) =
                           (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0xc0) |
                           (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x3c0);
                      *(uint *)(local_830.ray + 0x3c4) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3c4);
                      *(uint *)(local_830.ray + 0x3c8) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_830.ray + 0x3c8);
                      *(uint *)(local_830.ray + 0x3cc) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3cc);
                      *(uint *)(local_830.ray + 0x3d0) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3d0);
                      *(uint *)(local_830.ray + 0x3d4) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3d4);
                      *(uint *)(local_830.ray + 0x3d8) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3d8);
                      *(uint *)(local_830.ray + 0x3dc) =
                           (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3dc);
                      *(uint *)(local_830.ray + 0x3e0) =
                           (uint)(bVar96 & 1) * iVar85 |
                           (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x3e0);
                      *(uint *)(local_830.ray + 0x3e4) =
                           (uint)bVar27 * iVar86 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3e4);
                      *(uint *)(local_830.ray + 1000) =
                           (uint)bVar28 * iVar87 | (uint)!bVar28 * *(int *)(local_830.ray + 1000);
                      *(uint *)(local_830.ray + 0x3ec) =
                           (uint)bVar29 * iVar88 | (uint)!bVar29 * *(int *)(local_830.ray + 0x3ec);
                      *(uint *)(local_830.ray + 0x3f0) =
                           (uint)bVar30 * iVar89 | (uint)!bVar30 * *(int *)(local_830.ray + 0x3f0);
                      *(uint *)(local_830.ray + 0x3f4) =
                           (uint)bVar31 * iVar90 | (uint)!bVar31 * *(int *)(local_830.ray + 0x3f4);
                      *(uint *)(local_830.ray + 0x3f8) =
                           (uint)bVar32 * iVar91 | (uint)!bVar32 * *(int *)(local_830.ray + 0x3f8);
                      *(uint *)(local_830.ray + 0x3fc) =
                           (uint)bVar33 * iVar92 | (uint)!bVar33 * *(int *)(local_830.ray + 0x3fc);
                      iVar1 = *(int *)(local_830.hit + 0x104);
                      iVar2 = *(int *)(local_830.hit + 0x108);
                      iVar80 = *(int *)(local_830.hit + 0x10c);
                      iVar81 = *(int *)(local_830.hit + 0x110);
                      iVar82 = *(int *)(local_830.hit + 0x114);
                      iVar83 = *(int *)(local_830.hit + 0x118);
                      iVar84 = *(int *)(local_830.hit + 0x11c);
                      iVar85 = *(int *)(local_830.hit + 0x120);
                      iVar86 = *(int *)(local_830.hit + 0x124);
                      iVar87 = *(int *)(local_830.hit + 0x128);
                      iVar88 = *(int *)(local_830.hit + 300);
                      iVar89 = *(int *)(local_830.hit + 0x130);
                      iVar90 = *(int *)(local_830.hit + 0x134);
                      iVar91 = *(int *)(local_830.hit + 0x138);
                      iVar92 = *(int *)(local_830.hit + 0x13c);
                      bVar20 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar35 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar35 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
                      bVar26 = (bool)((byte)(uVar35 >> 7) & 1);
                      bVar27 = (bool)((byte)(uVar35 >> 9) & 1);
                      bVar28 = (bool)((byte)(uVar35 >> 10) & 1);
                      bVar29 = (bool)((byte)(uVar35 >> 0xb) & 1);
                      bVar30 = (bool)((byte)(uVar35 >> 0xc) & 1);
                      bVar31 = (bool)((byte)(uVar35 >> 0xd) & 1);
                      bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                      bVar33 = SUB81(uVar35 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x400) =
                           (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0x100) |
                           (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x400);
                      *(uint *)(local_830.ray + 0x404) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_830.ray + 0x404);
                      *(uint *)(local_830.ray + 0x408) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_830.ray + 0x408);
                      *(uint *)(local_830.ray + 0x40c) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x40c);
                      *(uint *)(local_830.ray + 0x410) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x410);
                      *(uint *)(local_830.ray + 0x414) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x414);
                      *(uint *)(local_830.ray + 0x418) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x418);
                      *(uint *)(local_830.ray + 0x41c) =
                           (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x41c);
                      *(uint *)(local_830.ray + 0x420) =
                           (uint)(bVar96 & 1) * iVar85 |
                           (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x420);
                      *(uint *)(local_830.ray + 0x424) =
                           (uint)bVar27 * iVar86 | (uint)!bVar27 * *(int *)(local_830.ray + 0x424);
                      *(uint *)(local_830.ray + 0x428) =
                           (uint)bVar28 * iVar87 | (uint)!bVar28 * *(int *)(local_830.ray + 0x428);
                      *(uint *)(local_830.ray + 0x42c) =
                           (uint)bVar29 * iVar88 | (uint)!bVar29 * *(int *)(local_830.ray + 0x42c);
                      *(uint *)(local_830.ray + 0x430) =
                           (uint)bVar30 * iVar89 | (uint)!bVar30 * *(int *)(local_830.ray + 0x430);
                      *(uint *)(local_830.ray + 0x434) =
                           (uint)bVar31 * iVar90 | (uint)!bVar31 * *(int *)(local_830.ray + 0x434);
                      *(uint *)(local_830.ray + 0x438) =
                           (uint)bVar32 * iVar91 | (uint)!bVar32 * *(int *)(local_830.ray + 0x438);
                      *(uint *)(local_830.ray + 0x43c) =
                           (uint)bVar33 * iVar92 | (uint)!bVar33 * *(int *)(local_830.ray + 0x43c);
                      auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                      auVar185 = vmovdqu32_avx512f(auVar185);
                      *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar185;
                      auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                      auVar185 = vmovdqu32_avx512f(auVar185);
                      *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar185;
                      auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                      auVar185 = vmovdqa32_avx512f(auVar185);
                      *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar185;
                      auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                      auVar185 = vmovdqa32_avx512f(auVar185);
                      *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar185;
                      local_780 = *(float *)(ray + k * 4 + 0x200);
                      fStack_77c = 0.0;
                      fStack_778 = 0.0;
                      fStack_774 = 0.0;
                    }
                    bVar105 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & (byte)uVar106;
                    auVar183._4_4_ = local_780;
                    auVar183._0_4_ = local_780;
                    auVar183._8_4_ = local_780;
                    auVar183._12_4_ = local_780;
                    auVar183._16_4_ = local_780;
                    auVar183._20_4_ = local_780;
                    auVar183._24_4_ = local_780;
                    auVar183._28_4_ = local_780;
                    uVar188 = vcmpps_avx512vl(auVar221._0_32_,auVar183,2);
                    if ((bVar105 & (byte)uVar188) == 0) goto LAB_01b7c488;
                    bVar105 = bVar105 & (byte)uVar188;
                    uVar106 = (ulong)bVar105;
                    auVar184._8_4_ = 0x7f800000;
                    auVar184._0_8_ = 0x7f8000007f800000;
                    auVar184._12_4_ = 0x7f800000;
                    auVar184._16_4_ = 0x7f800000;
                    auVar184._20_4_ = 0x7f800000;
                    auVar184._24_4_ = 0x7f800000;
                    auVar184._28_4_ = 0x7f800000;
                    auVar131 = vblendmps_avx512vl(auVar184,auVar221._0_32_);
                    auVar163._0_4_ =
                         (uint)(bVar105 & 1) * auVar131._0_4_ |
                         (uint)!(bool)(bVar105 & 1) * 0x7f800000;
                    bVar20 = (bool)(bVar105 >> 1 & 1);
                    auVar163._4_4_ = (uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar105 >> 2 & 1);
                    auVar163._8_4_ = (uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar105 >> 3 & 1);
                    auVar163._12_4_ = (uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar105 >> 4 & 1);
                    auVar163._16_4_ = (uint)bVar20 * auVar131._16_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar105 >> 5 & 1);
                    auVar163._20_4_ = (uint)bVar20 * auVar131._20_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar105 >> 6 & 1);
                    auVar163._24_4_ = (uint)bVar20 * auVar131._24_4_ | (uint)!bVar20 * 0x7f800000;
                    auVar163._28_4_ =
                         (uint)(bVar105 >> 7) * auVar131._28_4_ |
                         (uint)!(bool)(bVar105 >> 7) * 0x7f800000;
                    auVar131 = vshufps_avx(auVar163,auVar163,0xb1);
                    auVar131 = vminps_avx(auVar163,auVar131);
                    auVar134 = vshufpd_avx(auVar131,auVar131,5);
                    auVar131 = vminps_avx(auVar131,auVar134);
                    auVar134 = vpermpd_avx2(auVar131,0x4e);
                    auVar131 = vminps_avx(auVar131,auVar134);
                    uVar188 = vcmpps_avx512vl(auVar163,auVar131,0);
                    bVar96 = (byte)uVar188 & bVar105;
                    if (bVar96 != 0) {
                      bVar105 = bVar96;
                    }
                    uVar99 = 0;
                    for (uVar98 = (uint)bVar105; (uVar98 & 1) == 0;
                        uVar98 = uVar98 >> 1 | 0x80000000) {
                      uVar99 = uVar99 + 1;
                    }
                    uVar97 = (ulong)uVar99;
                  } while( true );
                }
                fVar191 = local_540[uVar97];
                uVar186 = *(undefined4 *)(local_520 + uVar97 * 4);
                fVar225 = 1.0 - fVar191;
                fVar223 = fVar225 * fVar225 * -3.0;
                auVar214 = ZEXT464((uint)fVar223);
                auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * fVar225)),
                                           ZEXT416((uint)(fVar191 * fVar225)),ZEXT416(0xc0000000));
                auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar191 * fVar225)),
                                           ZEXT416((uint)(fVar191 * fVar191)),ZEXT416(0x40000000));
                fVar225 = auVar110._0_4_ * 3.0;
                fVar187 = auVar109._0_4_ * 3.0;
                fVar199 = fVar191 * fVar191 * 3.0;
                auVar215._0_4_ = fVar199 * fVar34;
                auVar215._4_4_ = fVar199 * fVar78;
                auVar215._8_4_ = fVar199 * fVar79;
                auVar215._12_4_ = fVar199 * fVar95;
                auVar219 = ZEXT1664(auVar215);
                auVar192._4_4_ = fVar187;
                auVar192._0_4_ = fVar187;
                auVar192._8_4_ = fVar187;
                auVar192._12_4_ = fVar187;
                auVar110 = vfmadd132ps_fma(auVar192,auVar215,auVar112);
                auVar202._4_4_ = fVar225;
                auVar202._0_4_ = fVar225;
                auVar202._8_4_ = fVar225;
                auVar202._12_4_ = fVar225;
                auVar110 = vfmadd132ps_fma(auVar202,auVar110,auVar172);
                auVar193._4_4_ = fVar223;
                auVar193._0_4_ = fVar223;
                auVar193._8_4_ = fVar223;
                auVar193._12_4_ = fVar223;
                auVar110 = vfmadd132ps_fma(auVar193,auVar110,auVar7);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_500 + uVar97 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar110._0_4_;
                uVar15 = vextractps_avx(auVar110,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar15;
                uVar15 = vextractps_avx(auVar110,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar15;
                *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar186;
                *(uint *)(ray + k * 4 + 0x440) = uVar99;
                *(uint *)(ray + k * 4 + 0x480) = uVar13;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_01b7c488:
                fVar191 = (float)local_800._0_4_;
              }
            }
          }
        }
      }
    }
    local_800._0_4_ = fVar191;
    if (8 < iVar14) {
      auVar131 = vpbroadcastd_avx512vl();
      auVar185 = ZEXT3264(auVar131);
      local_780 = (float)local_800._0_4_;
      fStack_77c = (float)local_800._0_4_;
      fStack_778 = (float)local_800._0_4_;
      fStack_774 = (float)local_800._0_4_;
      fStack_770 = (float)local_800._0_4_;
      fStack_76c = (float)local_800._0_4_;
      fStack_768 = (float)local_800._0_4_;
      fStack_764 = (float)local_800._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_440 = 1.0 / (float)local_7a0._0_4_;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      lVar100 = 8;
LAB_01b7c519:
      if (lVar100 < iVar14) {
        auVar131 = vpbroadcastd_avx512vl();
        auVar131 = vpor_avx2(auVar131,_DAT_01fb4ba0);
        uVar36 = vpcmpgtd_avx512vl(auVar185._0_32_,auVar131);
        auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar100 * 4 + lVar103);
        auVar134 = *(undefined1 (*) [32])(lVar103 + 0x21fb768 + lVar100 * 4);
        auVar133 = *(undefined1 (*) [32])(lVar103 + 0x21fbbec + lVar100 * 4);
        auVar132 = *(undefined1 (*) [32])(lVar103 + 0x21fc070 + lVar100 * 4);
        auVar220._0_4_ = auVar132._0_4_ * (float)local_6e0._0_4_;
        auVar220._4_4_ = auVar132._4_4_ * (float)local_6e0._4_4_;
        auVar220._8_4_ = auVar132._8_4_ * fStack_6d8;
        auVar220._12_4_ = auVar132._12_4_ * fStack_6d4;
        auVar220._16_4_ = auVar132._16_4_ * fStack_6d0;
        auVar220._20_4_ = auVar132._20_4_ * fStack_6cc;
        auVar220._28_36_ = auVar219._28_36_;
        auVar220._24_4_ = auVar132._24_4_ * fStack_6c8;
        auVar219._0_4_ = auVar132._0_4_ * (float)local_700._0_4_;
        auVar219._4_4_ = auVar132._4_4_ * (float)local_700._4_4_;
        auVar219._8_4_ = auVar132._8_4_ * fStack_6f8;
        auVar219._12_4_ = auVar132._12_4_ * fStack_6f4;
        auVar219._16_4_ = auVar132._16_4_ * fStack_6f0;
        auVar219._20_4_ = auVar132._20_4_ * fStack_6ec;
        auVar219._28_36_ = auVar214._28_36_;
        auVar219._24_4_ = auVar132._24_4_ * fStack_6e8;
        auVar128 = vmulps_avx512vl(local_420,auVar132);
        auVar129 = vfmadd231ps_avx512vl(auVar220._0_32_,auVar133,local_6a0);
        auVar130 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar133,local_6c0);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar133,local_400);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar134,local_660);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar134,local_680);
        auVar123 = vfmadd231ps_avx512vl(auVar128,auVar134,local_3e0);
        auVar110 = vfmadd231ps_fma(auVar129,auVar131,local_620);
        auVar219 = ZEXT1664(auVar110);
        auVar109 = vfmadd231ps_fma(auVar130,auVar131,local_640);
        auVar214 = ZEXT1664(auVar109);
        auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar100 * 4 + lVar103);
        auVar129 = *(undefined1 (*) [32])(lVar103 + 0x21fdb88 + lVar100 * 4);
        auVar136 = vfmadd231ps_avx512vl(auVar123,auVar131,local_3c0);
        auVar130 = *(undefined1 (*) [32])(lVar103 + 0x21fe00c + lVar100 * 4);
        auVar123 = *(undefined1 (*) [32])(lVar103 + 0x21fe490 + lVar100 * 4);
        auVar222._0_4_ = auVar123._0_4_ * (float)local_6e0._0_4_;
        auVar222._4_4_ = auVar123._4_4_ * (float)local_6e0._4_4_;
        auVar222._8_4_ = auVar123._8_4_ * fStack_6d8;
        auVar222._12_4_ = auVar123._12_4_ * fStack_6d4;
        auVar222._16_4_ = auVar123._16_4_ * fStack_6d0;
        auVar222._20_4_ = auVar123._20_4_ * fStack_6cc;
        auVar222._28_36_ = auVar221._28_36_;
        auVar222._24_4_ = auVar123._24_4_ * fStack_6c8;
        auVar61._4_4_ = auVar123._4_4_ * (float)local_700._4_4_;
        auVar61._0_4_ = auVar123._0_4_ * (float)local_700._0_4_;
        auVar61._8_4_ = auVar123._8_4_ * fStack_6f8;
        auVar61._12_4_ = auVar123._12_4_ * fStack_6f4;
        auVar61._16_4_ = auVar123._16_4_ * fStack_6f0;
        auVar61._20_4_ = auVar123._20_4_ * fStack_6ec;
        auVar61._24_4_ = auVar123._24_4_ * fStack_6e8;
        auVar61._28_4_ = uStack_6e4;
        auVar124 = vmulps_avx512vl(local_420,auVar123);
        auVar135 = vfmadd231ps_avx512vl(auVar222._0_32_,auVar130,local_6a0);
        auVar137 = vfmadd231ps_avx512vl(auVar61,auVar130,local_6c0);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar130,local_400);
        auVar135 = vfmadd231ps_avx512vl(auVar135,auVar129,local_660);
        auVar137 = vfmadd231ps_avx512vl(auVar137,auVar129,local_680);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar129,local_3e0);
        auVar6 = vfmadd231ps_fma(auVar135,auVar128,local_620);
        auVar221 = ZEXT1664(auVar6);
        auVar8 = vfmadd231ps_fma(auVar137,auVar128,local_640);
        auVar137 = vfmadd231ps_avx512vl(auVar124,auVar128,local_3c0);
        auVar138 = vmaxps_avx512vl(auVar136,auVar137);
        auVar124 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar110));
        auVar135 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar109));
        auVar117 = vmulps_avx512vl(ZEXT1632(auVar109),auVar124);
        auVar118 = vmulps_avx512vl(ZEXT1632(auVar110),auVar135);
        auVar117 = vsubps_avx512vl(auVar117,auVar118);
        auVar118 = vmulps_avx512vl(auVar135,auVar135);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar124,auVar124);
        auVar138 = vmulps_avx512vl(auVar138,auVar138);
        auVar138 = vmulps_avx512vl(auVar138,auVar118);
        auVar117 = vmulps_avx512vl(auVar117,auVar117);
        uVar188 = vcmpps_avx512vl(auVar117,auVar138,2);
        bVar105 = (byte)uVar36 & (byte)uVar188;
        if (bVar105 != 0) {
          auVar123 = vmulps_avx512vl(local_4e0,auVar123);
          auVar130 = vfmadd213ps_avx512vl(auVar130,local_4c0,auVar123);
          auVar129 = vfmadd213ps_avx512vl(auVar129,local_4a0,auVar130);
          auVar128 = vfmadd213ps_avx512vl(auVar128,local_480,auVar129);
          auVar132 = vmulps_avx512vl(local_4e0,auVar132);
          auVar133 = vfmadd213ps_avx512vl(auVar133,local_4c0,auVar132);
          auVar134 = vfmadd213ps_avx512vl(auVar134,local_4a0,auVar133);
          auVar129 = vfmadd213ps_avx512vl(auVar131,local_480,auVar134);
          auVar131 = *(undefined1 (*) [32])(lVar103 + 0x21fc4f4 + lVar100 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar103 + 0x21fc978 + lVar100 * 4);
          auVar133 = *(undefined1 (*) [32])(lVar103 + 0x21fcdfc + lVar100 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar103 + 0x21fd280 + lVar100 * 4);
          auVar130 = vmulps_avx512vl(_local_6e0,auVar132);
          auVar123 = vmulps_avx512vl(_local_700,auVar132);
          auVar132 = vmulps_avx512vl(local_4e0,auVar132);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar133,local_6a0);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar133,local_6c0);
          auVar133 = vfmadd231ps_avx512vl(auVar132,local_4c0,auVar133);
          auVar132 = vfmadd231ps_avx512vl(auVar130,auVar134,local_660);
          auVar130 = vfmadd231ps_avx512vl(auVar123,auVar134,local_680);
          auVar134 = vfmadd231ps_avx512vl(auVar133,local_4a0,auVar134);
          auVar132 = vfmadd231ps_avx512vl(auVar132,auVar131,local_620);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar131,local_640);
          auVar123 = vfmadd231ps_avx512vl(auVar134,local_480,auVar131);
          auVar131 = *(undefined1 (*) [32])(lVar103 + 0x21fe914 + lVar100 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar103 + 0x21ff21c + lVar100 * 4);
          auVar133 = *(undefined1 (*) [32])(lVar103 + 0x21ff6a0 + lVar100 * 4);
          auVar138 = vmulps_avx512vl(_local_6e0,auVar133);
          auVar117 = vmulps_avx512vl(_local_700,auVar133);
          auVar133 = vmulps_avx512vl(local_4e0,auVar133);
          auVar138 = vfmadd231ps_avx512vl(auVar138,auVar134,local_6a0);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar134,local_6c0);
          auVar133 = vfmadd231ps_avx512vl(auVar133,local_4c0,auVar134);
          auVar134 = *(undefined1 (*) [32])(lVar103 + 0x21fed98 + lVar100 * 4);
          auVar138 = vfmadd231ps_avx512vl(auVar138,auVar134,local_660);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar134,local_680);
          auVar134 = vfmadd231ps_avx512vl(auVar133,local_4a0,auVar134);
          auVar133 = vfmadd231ps_avx512vl(auVar138,auVar131,local_620);
          auVar138 = vfmadd231ps_avx512vl(auVar117,auVar131,local_640);
          auVar134 = vfmadd231ps_avx512vl(auVar134,local_480,auVar131);
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar132,auVar117);
          vandps_avx512vl(auVar130,auVar117);
          auVar131 = vmaxps_avx(auVar117,auVar117);
          vandps_avx512vl(auVar123,auVar117);
          auVar131 = vmaxps_avx(auVar131,auVar117);
          auVar93._4_4_ = fStack_77c;
          auVar93._0_4_ = local_780;
          auVar93._8_4_ = fStack_778;
          auVar93._12_4_ = fStack_774;
          auVar93._16_4_ = fStack_770;
          auVar93._20_4_ = fStack_76c;
          auVar93._24_4_ = fStack_768;
          auVar93._28_4_ = fStack_764;
          uVar97 = vcmpps_avx512vl(auVar131,auVar93,1);
          bVar20 = (bool)((byte)uVar97 & 1);
          auVar151._0_4_ = (float)((uint)bVar20 * auVar124._0_4_ | (uint)!bVar20 * auVar132._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar151._4_4_ = (float)((uint)bVar20 * auVar124._4_4_ | (uint)!bVar20 * auVar132._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar151._8_4_ = (float)((uint)bVar20 * auVar124._8_4_ | (uint)!bVar20 * auVar132._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar151._12_4_ =
               (float)((uint)bVar20 * auVar124._12_4_ | (uint)!bVar20 * auVar132._12_4_);
          bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar151._16_4_ =
               (float)((uint)bVar20 * auVar124._16_4_ | (uint)!bVar20 * auVar132._16_4_);
          bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar151._20_4_ =
               (float)((uint)bVar20 * auVar124._20_4_ | (uint)!bVar20 * auVar132._20_4_);
          bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar151._24_4_ =
               (float)((uint)bVar20 * auVar124._24_4_ | (uint)!bVar20 * auVar132._24_4_);
          bVar20 = SUB81(uVar97 >> 7,0);
          auVar151._28_4_ = (uint)bVar20 * auVar124._28_4_ | (uint)!bVar20 * auVar132._28_4_;
          bVar20 = (bool)((byte)uVar97 & 1);
          auVar152._0_4_ = (float)((uint)bVar20 * auVar135._0_4_ | (uint)!bVar20 * auVar130._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar152._4_4_ = (float)((uint)bVar20 * auVar135._4_4_ | (uint)!bVar20 * auVar130._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar152._8_4_ = (float)((uint)bVar20 * auVar135._8_4_ | (uint)!bVar20 * auVar130._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar152._12_4_ =
               (float)((uint)bVar20 * auVar135._12_4_ | (uint)!bVar20 * auVar130._12_4_);
          bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar152._16_4_ =
               (float)((uint)bVar20 * auVar135._16_4_ | (uint)!bVar20 * auVar130._16_4_);
          bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar152._20_4_ =
               (float)((uint)bVar20 * auVar135._20_4_ | (uint)!bVar20 * auVar130._20_4_);
          bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar152._24_4_ =
               (float)((uint)bVar20 * auVar135._24_4_ | (uint)!bVar20 * auVar130._24_4_);
          bVar20 = SUB81(uVar97 >> 7,0);
          auVar152._28_4_ = (uint)bVar20 * auVar135._28_4_ | (uint)!bVar20 * auVar130._28_4_;
          vandps_avx512vl(auVar133,auVar117);
          vandps_avx512vl(auVar138,auVar117);
          auVar131 = vmaxps_avx(auVar152,auVar152);
          vandps_avx512vl(auVar134,auVar117);
          auVar131 = vmaxps_avx(auVar131,auVar152);
          uVar97 = vcmpps_avx512vl(auVar131,auVar93,1);
          bVar20 = (bool)((byte)uVar97 & 1);
          auVar153._0_4_ = (uint)bVar20 * auVar124._0_4_ | (uint)!bVar20 * auVar133._0_4_;
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar153._4_4_ = (uint)bVar20 * auVar124._4_4_ | (uint)!bVar20 * auVar133._4_4_;
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar153._8_4_ = (uint)bVar20 * auVar124._8_4_ | (uint)!bVar20 * auVar133._8_4_;
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar153._12_4_ = (uint)bVar20 * auVar124._12_4_ | (uint)!bVar20 * auVar133._12_4_;
          bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar153._16_4_ = (uint)bVar20 * auVar124._16_4_ | (uint)!bVar20 * auVar133._16_4_;
          bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar153._20_4_ = (uint)bVar20 * auVar124._20_4_ | (uint)!bVar20 * auVar133._20_4_;
          bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar153._24_4_ = (uint)bVar20 * auVar124._24_4_ | (uint)!bVar20 * auVar133._24_4_;
          bVar20 = SUB81(uVar97 >> 7,0);
          auVar153._28_4_ = (uint)bVar20 * auVar124._28_4_ | (uint)!bVar20 * auVar133._28_4_;
          bVar20 = (bool)((byte)uVar97 & 1);
          auVar154._0_4_ = (float)((uint)bVar20 * auVar135._0_4_ | (uint)!bVar20 * auVar138._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar154._4_4_ = (float)((uint)bVar20 * auVar135._4_4_ | (uint)!bVar20 * auVar138._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar154._8_4_ = (float)((uint)bVar20 * auVar135._8_4_ | (uint)!bVar20 * auVar138._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar154._12_4_ =
               (float)((uint)bVar20 * auVar135._12_4_ | (uint)!bVar20 * auVar138._12_4_);
          bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar154._16_4_ =
               (float)((uint)bVar20 * auVar135._16_4_ | (uint)!bVar20 * auVar138._16_4_);
          bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar154._20_4_ =
               (float)((uint)bVar20 * auVar135._20_4_ | (uint)!bVar20 * auVar138._20_4_);
          bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar154._24_4_ =
               (float)((uint)bVar20 * auVar135._24_4_ | (uint)!bVar20 * auVar138._24_4_);
          bVar20 = SUB81(uVar97 >> 7,0);
          auVar154._28_4_ = (uint)bVar20 * auVar135._28_4_ | (uint)!bVar20 * auVar138._28_4_;
          auVar227._8_4_ = 0x80000000;
          auVar227._0_8_ = 0x8000000080000000;
          auVar227._12_4_ = 0x80000000;
          auVar227._16_4_ = 0x80000000;
          auVar227._20_4_ = 0x80000000;
          auVar227._24_4_ = 0x80000000;
          auVar227._28_4_ = 0x80000000;
          auVar131 = vxorps_avx512vl(auVar153,auVar227);
          auVar116 = vxorps_avx512vl(auVar117._0_16_,auVar117._0_16_);
          auVar134 = vfmadd213ps_avx512vl(auVar151,auVar151,ZEXT1632(auVar116));
          auVar9 = vfmadd231ps_fma(auVar134,auVar152,auVar152);
          auVar134 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar235._8_4_ = 0xbf000000;
          auVar235._0_8_ = 0xbf000000bf000000;
          auVar235._12_4_ = 0xbf000000;
          auVar235._16_4_ = 0xbf000000;
          auVar235._20_4_ = 0xbf000000;
          auVar235._24_4_ = 0xbf000000;
          auVar235._28_4_ = 0xbf000000;
          fVar191 = auVar134._0_4_;
          fVar223 = auVar134._4_4_;
          fVar225 = auVar134._8_4_;
          fVar187 = auVar134._12_4_;
          fVar199 = auVar134._16_4_;
          fVar190 = auVar134._20_4_;
          fVar198 = auVar134._24_4_;
          auVar62._4_4_ = fVar223 * fVar223 * fVar223 * auVar9._4_4_ * -0.5;
          auVar62._0_4_ = fVar191 * fVar191 * fVar191 * auVar9._0_4_ * -0.5;
          auVar62._8_4_ = fVar225 * fVar225 * fVar225 * auVar9._8_4_ * -0.5;
          auVar62._12_4_ = fVar187 * fVar187 * fVar187 * auVar9._12_4_ * -0.5;
          auVar62._16_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar62._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar62._24_4_ = fVar198 * fVar198 * fVar198 * -0.0;
          auVar62._28_4_ = auVar152._28_4_;
          auVar133 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar134 = vfmadd231ps_avx512vl(auVar62,auVar133,auVar134);
          auVar63._4_4_ = auVar152._4_4_ * auVar134._4_4_;
          auVar63._0_4_ = auVar152._0_4_ * auVar134._0_4_;
          auVar63._8_4_ = auVar152._8_4_ * auVar134._8_4_;
          auVar63._12_4_ = auVar152._12_4_ * auVar134._12_4_;
          auVar63._16_4_ = auVar152._16_4_ * auVar134._16_4_;
          auVar63._20_4_ = auVar152._20_4_ * auVar134._20_4_;
          auVar63._24_4_ = auVar152._24_4_ * auVar134._24_4_;
          auVar63._28_4_ = 0;
          auVar64._4_4_ = auVar134._4_4_ * -auVar151._4_4_;
          auVar64._0_4_ = auVar134._0_4_ * -auVar151._0_4_;
          auVar64._8_4_ = auVar134._8_4_ * -auVar151._8_4_;
          auVar64._12_4_ = auVar134._12_4_ * -auVar151._12_4_;
          auVar64._16_4_ = auVar134._16_4_ * -auVar151._16_4_;
          auVar64._20_4_ = auVar134._20_4_ * -auVar151._20_4_;
          auVar64._24_4_ = auVar134._24_4_ * -auVar151._24_4_;
          auVar64._28_4_ = auVar152._28_4_;
          auVar132 = vmulps_avx512vl(auVar134,ZEXT1632(auVar116));
          auVar123 = ZEXT1632(auVar116);
          auVar134 = vfmadd213ps_avx512vl(auVar153,auVar153,auVar123);
          auVar134 = vfmadd231ps_avx512vl(auVar134,auVar154,auVar154);
          auVar130 = vrsqrt14ps_avx512vl(auVar134);
          auVar134 = vmulps_avx512vl(auVar134,auVar235);
          fVar191 = auVar130._0_4_;
          fVar223 = auVar130._4_4_;
          fVar225 = auVar130._8_4_;
          fVar187 = auVar130._12_4_;
          fVar199 = auVar130._16_4_;
          fVar190 = auVar130._20_4_;
          fVar198 = auVar130._24_4_;
          auVar65._4_4_ = fVar223 * fVar223 * fVar223 * auVar134._4_4_;
          auVar65._0_4_ = fVar191 * fVar191 * fVar191 * auVar134._0_4_;
          auVar65._8_4_ = fVar225 * fVar225 * fVar225 * auVar134._8_4_;
          auVar65._12_4_ = fVar187 * fVar187 * fVar187 * auVar134._12_4_;
          auVar65._16_4_ = fVar199 * fVar199 * fVar199 * auVar134._16_4_;
          auVar65._20_4_ = fVar190 * fVar190 * fVar190 * auVar134._20_4_;
          auVar65._24_4_ = fVar198 * fVar198 * fVar198 * auVar134._24_4_;
          auVar65._28_4_ = auVar134._28_4_;
          auVar134 = vfmadd231ps_avx512vl(auVar65,auVar133,auVar130);
          auVar66._4_4_ = auVar154._4_4_ * auVar134._4_4_;
          auVar66._0_4_ = auVar154._0_4_ * auVar134._0_4_;
          auVar66._8_4_ = auVar154._8_4_ * auVar134._8_4_;
          auVar66._12_4_ = auVar154._12_4_ * auVar134._12_4_;
          auVar66._16_4_ = auVar154._16_4_ * auVar134._16_4_;
          auVar66._20_4_ = auVar154._20_4_ * auVar134._20_4_;
          auVar66._24_4_ = auVar154._24_4_ * auVar134._24_4_;
          auVar66._28_4_ = auVar130._28_4_;
          auVar67._4_4_ = auVar134._4_4_ * auVar131._4_4_;
          auVar67._0_4_ = auVar134._0_4_ * auVar131._0_4_;
          auVar67._8_4_ = auVar134._8_4_ * auVar131._8_4_;
          auVar67._12_4_ = auVar134._12_4_ * auVar131._12_4_;
          auVar67._16_4_ = auVar134._16_4_ * auVar131._16_4_;
          auVar67._20_4_ = auVar134._20_4_ * auVar131._20_4_;
          auVar67._24_4_ = auVar134._24_4_ * auVar131._24_4_;
          auVar67._28_4_ = auVar131._28_4_;
          auVar131 = vmulps_avx512vl(auVar134,auVar123);
          auVar9 = vfmadd213ps_fma(auVar63,auVar136,ZEXT1632(auVar110));
          auVar10 = vfmadd213ps_fma(auVar64,auVar136,ZEXT1632(auVar109));
          auVar133 = vfmadd213ps_avx512vl(auVar132,auVar136,auVar129);
          auVar130 = vfmadd213ps_avx512vl(auVar66,auVar137,ZEXT1632(auVar6));
          auVar12 = vfnmadd213ps_fma(auVar63,auVar136,ZEXT1632(auVar110));
          auVar110 = vfmadd213ps_fma(auVar67,auVar137,ZEXT1632(auVar8));
          auVar233 = vfnmadd213ps_fma(auVar64,auVar136,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar131,auVar137,auVar128);
          auVar114 = vfnmadd231ps_fma(auVar129,auVar136,auVar132);
          auVar111 = vfnmadd213ps_fma(auVar66,auVar137,ZEXT1632(auVar6));
          auVar113 = vfnmadd213ps_fma(auVar67,auVar137,ZEXT1632(auVar8));
          auVar115 = vfnmadd231ps_fma(auVar128,auVar137,auVar131);
          auVar128 = vsubps_avx512vl(auVar130,ZEXT1632(auVar12));
          auVar131 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar233));
          auVar134 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar114));
          auVar68._4_4_ = auVar131._4_4_ * auVar114._4_4_;
          auVar68._0_4_ = auVar131._0_4_ * auVar114._0_4_;
          auVar68._8_4_ = auVar131._8_4_ * auVar114._8_4_;
          auVar68._12_4_ = auVar131._12_4_ * auVar114._12_4_;
          auVar68._16_4_ = auVar131._16_4_ * 0.0;
          auVar68._20_4_ = auVar131._20_4_ * 0.0;
          auVar68._24_4_ = auVar131._24_4_ * 0.0;
          auVar68._28_4_ = auVar132._28_4_;
          auVar6 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar233),auVar134);
          auVar69._4_4_ = auVar134._4_4_ * auVar12._4_4_;
          auVar69._0_4_ = auVar134._0_4_ * auVar12._0_4_;
          auVar69._8_4_ = auVar134._8_4_ * auVar12._8_4_;
          auVar69._12_4_ = auVar134._12_4_ * auVar12._12_4_;
          auVar69._16_4_ = auVar134._16_4_ * 0.0;
          auVar69._20_4_ = auVar134._20_4_ * 0.0;
          auVar69._24_4_ = auVar134._24_4_ * 0.0;
          auVar69._28_4_ = auVar134._28_4_;
          auVar8 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar114),auVar128);
          auVar70._4_4_ = auVar233._4_4_ * auVar128._4_4_;
          auVar70._0_4_ = auVar233._0_4_ * auVar128._0_4_;
          auVar70._8_4_ = auVar233._8_4_ * auVar128._8_4_;
          auVar70._12_4_ = auVar233._12_4_ * auVar128._12_4_;
          auVar70._16_4_ = auVar128._16_4_ * 0.0;
          auVar70._20_4_ = auVar128._20_4_ * 0.0;
          auVar70._24_4_ = auVar128._24_4_ * 0.0;
          auVar70._28_4_ = auVar128._28_4_;
          auVar11 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar12),auVar131);
          auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar123,ZEXT1632(auVar8));
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar123,ZEXT1632(auVar6));
          auVar117 = ZEXT1632(auVar116);
          uVar97 = vcmpps_avx512vl(auVar131,auVar117,2);
          bVar96 = (byte)uVar97;
          fVar164 = (float)((uint)(bVar96 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar96 & 1) * auVar111._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          fVar166 = (float)((uint)bVar20 * auVar9._4_4_ | (uint)!bVar20 * auVar111._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          fVar168 = (float)((uint)bVar20 * auVar9._8_4_ | (uint)!bVar20 * auVar111._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          fVar170 = (float)((uint)bVar20 * auVar9._12_4_ | (uint)!bVar20 * auVar111._12_4_);
          auVar123 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar168,CONCAT44(fVar166,fVar164))));
          fVar165 = (float)((uint)(bVar96 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar96 & 1) * auVar113._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          fVar167 = (float)((uint)bVar20 * auVar10._4_4_ | (uint)!bVar20 * auVar113._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          fVar169 = (float)((uint)bVar20 * auVar10._8_4_ | (uint)!bVar20 * auVar113._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          fVar171 = (float)((uint)bVar20 * auVar10._12_4_ | (uint)!bVar20 * auVar113._12_4_);
          auVar124 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar169,CONCAT44(fVar167,fVar165))));
          auVar155._0_4_ =
               (float)((uint)(bVar96 & 1) * auVar133._0_4_ |
                      (uint)!(bool)(bVar96 & 1) * auVar115._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar155._4_4_ = (float)((uint)bVar20 * auVar133._4_4_ | (uint)!bVar20 * auVar115._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar155._8_4_ = (float)((uint)bVar20 * auVar133._8_4_ | (uint)!bVar20 * auVar115._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar155._12_4_ =
               (float)((uint)bVar20 * auVar133._12_4_ | (uint)!bVar20 * auVar115._12_4_);
          fVar191 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar133._16_4_);
          auVar155._16_4_ = fVar191;
          fVar223 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar133._20_4_);
          auVar155._20_4_ = fVar223;
          fVar225 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar133._24_4_);
          auVar155._24_4_ = fVar225;
          iVar1 = (uint)(byte)(uVar97 >> 7) * auVar133._28_4_;
          auVar155._28_4_ = iVar1;
          auVar131 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar130);
          auVar156._0_4_ =
               (uint)(bVar96 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar6._0_4_;
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar156._4_4_ = (uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * auVar6._4_4_;
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar156._8_4_ = (uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * auVar6._8_4_;
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar156._12_4_ = (uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * auVar6._12_4_;
          auVar156._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar131._16_4_;
          auVar156._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar131._20_4_;
          auVar156._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar131._24_4_;
          auVar156._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar131._28_4_;
          auVar131 = vblendmps_avx512vl(ZEXT1632(auVar233),ZEXT1632(auVar110));
          auVar157._0_4_ =
               (float)((uint)(bVar96 & 1) * auVar131._0_4_ |
                      (uint)!(bool)(bVar96 & 1) * auVar9._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar157._4_4_ = (float)((uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * auVar9._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar157._8_4_ = (float)((uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * auVar9._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar157._12_4_ = (float)((uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * auVar9._12_4_);
          fVar190 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar131._16_4_);
          auVar157._16_4_ = fVar190;
          fVar199 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar131._20_4_);
          auVar157._20_4_ = fVar199;
          fVar187 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar131._24_4_);
          auVar157._24_4_ = fVar187;
          auVar157._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar131._28_4_;
          auVar131 = vblendmps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar109));
          auVar158._0_4_ =
               (float)((uint)(bVar96 & 1) * auVar131._0_4_ |
                      (uint)!(bool)(bVar96 & 1) * auVar10._0_4_);
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar158._4_4_ = (float)((uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * auVar10._4_4_);
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar158._8_4_ = (float)((uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * auVar10._8_4_);
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar158._12_4_ = (float)((uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * auVar10._12_4_)
          ;
          fVar198 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar131._16_4_);
          auVar158._16_4_ = fVar198;
          fVar107 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar131._20_4_);
          auVar158._20_4_ = fVar107;
          fVar108 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar131._24_4_);
          auVar158._24_4_ = fVar108;
          iVar2 = (uint)(byte)(uVar97 >> 7) * auVar131._28_4_;
          auVar158._28_4_ = iVar2;
          auVar159._0_4_ =
               (uint)(bVar96 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar130._0_4_;
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar159._4_4_ = (uint)bVar20 * (int)auVar12._4_4_ | (uint)!bVar20 * auVar130._4_4_;
          bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar159._8_4_ = (uint)bVar20 * (int)auVar12._8_4_ | (uint)!bVar20 * auVar130._8_4_;
          bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar159._12_4_ = (uint)bVar20 * (int)auVar12._12_4_ | (uint)!bVar20 * auVar130._12_4_;
          auVar159._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar130._16_4_;
          auVar159._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar130._20_4_;
          auVar159._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar130._24_4_;
          auVar159._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar130._28_4_;
          bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
          bVar24 = (bool)((byte)(uVar97 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar97 >> 1) & 1);
          bVar23 = (bool)((byte)(uVar97 >> 2) & 1);
          bVar25 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar130 = vsubps_avx512vl(auVar159,auVar123);
          auVar134 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar233._12_4_ |
                                                   (uint)!bVar24 * auVar110._12_4_,
                                                   CONCAT48((uint)bVar22 * (int)auVar233._8_4_ |
                                                            (uint)!bVar22 * auVar110._8_4_,
                                                            CONCAT44((uint)bVar20 *
                                                                     (int)auVar233._4_4_ |
                                                                     (uint)!bVar20 * auVar110._4_4_,
                                                                     (uint)(bVar96 & 1) *
                                                                     (int)auVar233._0_4_ |
                                                                     (uint)!(bool)(bVar96 & 1) *
                                                                     auVar110._0_4_)))),auVar124);
          auVar219 = ZEXT3264(auVar134);
          auVar133 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar25 * (int)auVar114._12_4_ |
                                                   (uint)!bVar25 * auVar109._12_4_,
                                                   CONCAT48((uint)bVar23 * (int)auVar114._8_4_ |
                                                            (uint)!bVar23 * auVar109._8_4_,
                                                            CONCAT44((uint)bVar21 *
                                                                     (int)auVar114._4_4_ |
                                                                     (uint)!bVar21 * auVar109._4_4_,
                                                                     (uint)(bVar96 & 1) *
                                                                     (int)auVar114._0_4_ |
                                                                     (uint)!(bool)(bVar96 & 1) *
                                                                     auVar109._0_4_)))),auVar155);
          auVar132 = vsubps_avx(auVar123,auVar156);
          auVar221 = ZEXT3264(auVar132);
          auVar128 = vsubps_avx(auVar124,auVar157);
          auVar129 = vsubps_avx(auVar155,auVar158);
          auVar71._4_4_ = auVar133._4_4_ * fVar166;
          auVar71._0_4_ = auVar133._0_4_ * fVar164;
          auVar71._8_4_ = auVar133._8_4_ * fVar168;
          auVar71._12_4_ = auVar133._12_4_ * fVar170;
          auVar71._16_4_ = auVar133._16_4_ * 0.0;
          auVar71._20_4_ = auVar133._20_4_ * 0.0;
          auVar71._24_4_ = auVar133._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar110 = vfmsub231ps_fma(auVar71,auVar155,auVar130);
          auVar207._0_4_ = fVar165 * auVar130._0_4_;
          auVar207._4_4_ = fVar167 * auVar130._4_4_;
          auVar207._8_4_ = fVar169 * auVar130._8_4_;
          auVar207._12_4_ = fVar171 * auVar130._12_4_;
          auVar207._16_4_ = auVar130._16_4_ * 0.0;
          auVar207._20_4_ = auVar130._20_4_ * 0.0;
          auVar207._24_4_ = auVar130._24_4_ * 0.0;
          auVar207._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar207,auVar123,auVar134);
          auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar117,ZEXT1632(auVar110));
          auVar212._0_4_ = auVar134._0_4_ * auVar155._0_4_;
          auVar212._4_4_ = auVar134._4_4_ * auVar155._4_4_;
          auVar212._8_4_ = auVar134._8_4_ * auVar155._8_4_;
          auVar212._12_4_ = auVar134._12_4_ * auVar155._12_4_;
          auVar212._16_4_ = auVar134._16_4_ * fVar191;
          auVar212._20_4_ = auVar134._20_4_ * fVar223;
          auVar212._24_4_ = auVar134._24_4_ * fVar225;
          auVar212._28_4_ = 0;
          auVar110 = vfmsub231ps_fma(auVar212,auVar124,auVar133);
          auVar135 = vfmadd231ps_avx512vl(auVar131,auVar117,ZEXT1632(auVar110));
          auVar131 = vmulps_avx512vl(auVar129,auVar156);
          auVar131 = vfmsub231ps_avx512vl(auVar131,auVar132,auVar158);
          auVar72._4_4_ = auVar128._4_4_ * auVar158._4_4_;
          auVar72._0_4_ = auVar128._0_4_ * auVar158._0_4_;
          auVar72._8_4_ = auVar128._8_4_ * auVar158._8_4_;
          auVar72._12_4_ = auVar128._12_4_ * auVar158._12_4_;
          auVar72._16_4_ = auVar128._16_4_ * fVar198;
          auVar72._20_4_ = auVar128._20_4_ * fVar107;
          auVar72._24_4_ = auVar128._24_4_ * fVar108;
          auVar72._28_4_ = iVar2;
          auVar110 = vfmsub231ps_fma(auVar72,auVar157,auVar129);
          auVar213._0_4_ = auVar157._0_4_ * auVar132._0_4_;
          auVar213._4_4_ = auVar157._4_4_ * auVar132._4_4_;
          auVar213._8_4_ = auVar157._8_4_ * auVar132._8_4_;
          auVar213._12_4_ = auVar157._12_4_ * auVar132._12_4_;
          auVar213._16_4_ = fVar190 * auVar132._16_4_;
          auVar213._20_4_ = fVar199 * auVar132._20_4_;
          auVar213._24_4_ = fVar187 * auVar132._24_4_;
          auVar213._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar213,auVar128,auVar156);
          auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar109),auVar117,auVar131);
          auVar138 = vfmadd231ps_avx512vl(auVar131,auVar117,ZEXT1632(auVar110));
          auVar214 = ZEXT3264(auVar138);
          auVar131 = vmaxps_avx(auVar135,auVar138);
          uVar188 = vcmpps_avx512vl(auVar131,auVar117,2);
          bVar105 = bVar105 & (byte)uVar188;
          if (bVar105 != 0) {
            auVar73._4_4_ = auVar129._4_4_ * auVar134._4_4_;
            auVar73._0_4_ = auVar129._0_4_ * auVar134._0_4_;
            auVar73._8_4_ = auVar129._8_4_ * auVar134._8_4_;
            auVar73._12_4_ = auVar129._12_4_ * auVar134._12_4_;
            auVar73._16_4_ = auVar129._16_4_ * auVar134._16_4_;
            auVar73._20_4_ = auVar129._20_4_ * auVar134._20_4_;
            auVar73._24_4_ = auVar129._24_4_ * auVar134._24_4_;
            auVar73._28_4_ = auVar131._28_4_;
            auVar8 = vfmsub231ps_fma(auVar73,auVar128,auVar133);
            auVar74._4_4_ = auVar133._4_4_ * auVar132._4_4_;
            auVar74._0_4_ = auVar133._0_4_ * auVar132._0_4_;
            auVar74._8_4_ = auVar133._8_4_ * auVar132._8_4_;
            auVar74._12_4_ = auVar133._12_4_ * auVar132._12_4_;
            auVar74._16_4_ = auVar133._16_4_ * auVar132._16_4_;
            auVar74._20_4_ = auVar133._20_4_ * auVar132._20_4_;
            auVar74._24_4_ = auVar133._24_4_ * auVar132._24_4_;
            auVar74._28_4_ = auVar133._28_4_;
            auVar6 = vfmsub231ps_fma(auVar74,auVar130,auVar129);
            auVar75._4_4_ = auVar128._4_4_ * auVar130._4_4_;
            auVar75._0_4_ = auVar128._0_4_ * auVar130._0_4_;
            auVar75._8_4_ = auVar128._8_4_ * auVar130._8_4_;
            auVar75._12_4_ = auVar128._12_4_ * auVar130._12_4_;
            auVar75._16_4_ = auVar128._16_4_ * auVar130._16_4_;
            auVar75._20_4_ = auVar128._20_4_ * auVar130._20_4_;
            auVar75._24_4_ = auVar128._24_4_ * auVar130._24_4_;
            auVar75._28_4_ = auVar128._28_4_;
            auVar9 = vfmsub231ps_fma(auVar75,auVar132,auVar134);
            auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
            auVar109 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar8),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar131 = vrcp14ps_avx512vl(ZEXT1632(auVar109));
            auVar42._8_4_ = 0x3f800000;
            auVar42._0_8_ = 0x3f8000003f800000;
            auVar42._12_4_ = 0x3f800000;
            auVar42._16_4_ = 0x3f800000;
            auVar42._20_4_ = 0x3f800000;
            auVar42._24_4_ = 0x3f800000;
            auVar42._28_4_ = 0x3f800000;
            auVar134 = vfnmadd213ps_avx512vl(auVar131,ZEXT1632(auVar109),auVar42);
            auVar110 = vfmadd132ps_fma(auVar134,auVar131,auVar131);
            auVar219 = ZEXT1664(auVar110);
            auVar76._4_4_ = auVar9._4_4_ * auVar155._4_4_;
            auVar76._0_4_ = auVar9._0_4_ * auVar155._0_4_;
            auVar76._8_4_ = auVar9._8_4_ * auVar155._8_4_;
            auVar76._12_4_ = auVar9._12_4_ * auVar155._12_4_;
            auVar76._16_4_ = fVar191 * 0.0;
            auVar76._20_4_ = fVar223 * 0.0;
            auVar76._24_4_ = fVar225 * 0.0;
            auVar76._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar76,auVar124,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar123,ZEXT1632(auVar8));
            fVar191 = auVar110._0_4_;
            fVar223 = auVar110._4_4_;
            fVar225 = auVar110._8_4_;
            fVar187 = auVar110._12_4_;
            local_5c0._28_4_ = auVar131._28_4_;
            local_5c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar6._12_4_ * fVar187,
                                    CONCAT48(auVar6._8_4_ * fVar225,
                                             CONCAT44(auVar6._4_4_ * fVar223,auVar6._0_4_ * fVar191)
                                            )));
            auVar221 = ZEXT3264(local_5c0);
            auVar94._4_4_ = uStack_75c;
            auVar94._0_4_ = local_760;
            auVar94._8_4_ = uStack_758;
            auVar94._12_4_ = uStack_754;
            auVar94._16_4_ = uStack_750;
            auVar94._20_4_ = uStack_74c;
            auVar94._24_4_ = uStack_748;
            auVar94._28_4_ = uStack_744;
            uVar188 = vcmpps_avx512vl(local_5c0,auVar94,0xd);
            uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar43._4_4_ = uVar186;
            auVar43._0_4_ = uVar186;
            auVar43._8_4_ = uVar186;
            auVar43._12_4_ = uVar186;
            auVar43._16_4_ = uVar186;
            auVar43._20_4_ = uVar186;
            auVar43._24_4_ = uVar186;
            auVar43._28_4_ = uVar186;
            uVar36 = vcmpps_avx512vl(local_5c0,auVar43,2);
            bVar105 = (byte)uVar188 & (byte)uVar36 & bVar105;
            if (bVar105 != 0) {
              uVar106 = vcmpps_avx512vl(ZEXT1632(auVar109),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar106 = bVar105 & uVar106;
              if ((char)uVar106 != '\0') {
                fVar199 = auVar135._0_4_ * fVar191;
                fVar190 = auVar135._4_4_ * fVar223;
                auVar77._4_4_ = fVar190;
                auVar77._0_4_ = fVar199;
                fVar198 = auVar135._8_4_ * fVar225;
                auVar77._8_4_ = fVar198;
                fVar107 = auVar135._12_4_ * fVar187;
                auVar77._12_4_ = fVar107;
                fVar108 = auVar135._16_4_ * 0.0;
                auVar77._16_4_ = fVar108;
                fVar164 = auVar135._20_4_ * 0.0;
                auVar77._20_4_ = fVar164;
                fVar165 = auVar135._24_4_ * 0.0;
                auVar77._24_4_ = fVar165;
                auVar77._28_4_ = auVar135._28_4_;
                auVar197._8_4_ = 0x3f800000;
                auVar197._0_8_ = 0x3f8000003f800000;
                auVar197._12_4_ = 0x3f800000;
                auVar197._16_4_ = 0x3f800000;
                auVar197._20_4_ = 0x3f800000;
                auVar197._24_4_ = 0x3f800000;
                auVar197._28_4_ = 0x3f800000;
                auVar131 = vsubps_avx(auVar197,auVar77);
                local_600._0_4_ =
                     (float)((uint)(bVar96 & 1) * (int)fVar199 |
                            (uint)!(bool)(bVar96 & 1) * auVar131._0_4_);
                bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
                local_600._4_4_ =
                     (float)((uint)bVar20 * (int)fVar190 | (uint)!bVar20 * auVar131._4_4_);
                bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
                local_600._8_4_ =
                     (float)((uint)bVar20 * (int)fVar198 | (uint)!bVar20 * auVar131._8_4_);
                bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
                local_600._12_4_ =
                     (float)((uint)bVar20 * (int)fVar107 | (uint)!bVar20 * auVar131._12_4_);
                bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
                local_600._16_4_ =
                     (float)((uint)bVar20 * (int)fVar108 | (uint)!bVar20 * auVar131._16_4_);
                bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                local_600._20_4_ =
                     (float)((uint)bVar20 * (int)fVar164 | (uint)!bVar20 * auVar131._20_4_);
                bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
                local_600._24_4_ =
                     (float)((uint)bVar20 * (int)fVar165 | (uint)!bVar20 * auVar131._24_4_);
                bVar20 = SUB81(uVar97 >> 7,0);
                local_600._28_4_ =
                     (float)((uint)bVar20 * auVar135._28_4_ | (uint)!bVar20 * auVar131._28_4_);
                auVar131 = vsubps_avx(auVar137,auVar136);
                auVar110 = vfmadd213ps_fma(auVar131,local_600,auVar136);
                uVar186 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
                auVar44._4_4_ = uVar186;
                auVar44._0_4_ = uVar186;
                auVar44._8_4_ = uVar186;
                auVar44._12_4_ = uVar186;
                auVar44._16_4_ = uVar186;
                auVar44._20_4_ = uVar186;
                auVar44._24_4_ = uVar186;
                auVar44._28_4_ = uVar186;
                auVar131 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar110._12_4_ + auVar110._12_4_,
                                                              CONCAT48(auVar110._8_4_ +
                                                                       auVar110._8_4_,
                                                                       CONCAT44(auVar110._4_4_ +
                                                                                auVar110._4_4_,
                                                                                auVar110._0_4_ +
                                                                                auVar110._0_4_)))),
                                           auVar44);
                uVar35 = vcmpps_avx512vl(local_5c0,auVar131,6);
                uVar106 = uVar106 & uVar35;
                bVar105 = (byte)uVar106;
                if (bVar105 != 0) {
                  auVar189._0_4_ = auVar138._0_4_ * fVar191;
                  auVar189._4_4_ = auVar138._4_4_ * fVar223;
                  auVar189._8_4_ = auVar138._8_4_ * fVar225;
                  auVar189._12_4_ = auVar138._12_4_ * fVar187;
                  auVar189._16_4_ = auVar138._16_4_ * 0.0;
                  auVar189._20_4_ = auVar138._20_4_ * 0.0;
                  auVar189._24_4_ = auVar138._24_4_ * 0.0;
                  auVar189._28_4_ = 0;
                  auVar208._8_4_ = 0x3f800000;
                  auVar208._0_8_ = 0x3f8000003f800000;
                  auVar208._12_4_ = 0x3f800000;
                  auVar208._16_4_ = 0x3f800000;
                  auVar208._20_4_ = 0x3f800000;
                  auVar208._24_4_ = 0x3f800000;
                  auVar208._28_4_ = 0x3f800000;
                  auVar131 = vsubps_avx(auVar208,auVar189);
                  auVar160._0_4_ =
                       (uint)(bVar96 & 1) * (int)auVar189._0_4_ |
                       (uint)!(bool)(bVar96 & 1) * auVar131._0_4_;
                  bVar20 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar160._4_4_ =
                       (uint)bVar20 * (int)auVar189._4_4_ | (uint)!bVar20 * auVar131._4_4_;
                  bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar160._8_4_ =
                       (uint)bVar20 * (int)auVar189._8_4_ | (uint)!bVar20 * auVar131._8_4_;
                  bVar20 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar160._12_4_ =
                       (uint)bVar20 * (int)auVar189._12_4_ | (uint)!bVar20 * auVar131._12_4_;
                  bVar20 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar160._16_4_ =
                       (uint)bVar20 * (int)auVar189._16_4_ | (uint)!bVar20 * auVar131._16_4_;
                  bVar20 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar160._20_4_ =
                       (uint)bVar20 * (int)auVar189._20_4_ | (uint)!bVar20 * auVar131._20_4_;
                  bVar20 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar160._24_4_ =
                       (uint)bVar20 * (int)auVar189._24_4_ | (uint)!bVar20 * auVar131._24_4_;
                  auVar160._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar131._28_4_;
                  auVar45._8_4_ = 0x40000000;
                  auVar45._0_8_ = 0x4000000040000000;
                  auVar45._12_4_ = 0x40000000;
                  auVar45._16_4_ = 0x40000000;
                  auVar45._20_4_ = 0x40000000;
                  auVar45._24_4_ = 0x40000000;
                  auVar45._28_4_ = 0x40000000;
                  local_5e0 = vfmsub132ps_avx512vl(auVar160,auVar208,auVar45);
                  local_5a0 = (undefined4)lVar100;
                  local_590 = local_840;
                  uStack_588 = uStack_838;
                  local_580 = local_860;
                  uStack_578 = uStack_858;
                  local_570 = local_870;
                  uStack_568 = uStack_868;
                  local_560 = local_850;
                  uStack_558 = uStack_848;
                  pGVar102 = (context->scene->geometries).items[uVar13].ptr;
                  if ((pGVar102->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar110 = vcvtsi2ss_avx512f(auVar116,local_5a0);
                    fVar191 = auVar110._0_4_;
                    local_540[0] = (fVar191 + local_600._0_4_ + 0.0) * local_440;
                    local_540[1] = (fVar191 + local_600._4_4_ + 1.0) * fStack_43c;
                    local_540[2] = (fVar191 + local_600._8_4_ + 2.0) * fStack_438;
                    local_540[3] = (fVar191 + local_600._12_4_ + 3.0) * fStack_434;
                    fStack_530 = (fVar191 + local_600._16_4_ + 4.0) * fStack_430;
                    fStack_52c = (fVar191 + local_600._20_4_ + 5.0) * fStack_42c;
                    fStack_528 = (fVar191 + local_600._24_4_ + 6.0) * fStack_428;
                    fStack_524 = fVar191 + local_600._28_4_ + 7.0;
                    local_520 = local_5e0;
                    local_500 = local_5c0;
                    auVar180._8_4_ = 0x7f800000;
                    auVar180._0_8_ = 0x7f8000007f800000;
                    auVar180._12_4_ = 0x7f800000;
                    auVar180._16_4_ = 0x7f800000;
                    auVar180._20_4_ = 0x7f800000;
                    auVar180._24_4_ = 0x7f800000;
                    auVar180._28_4_ = 0x7f800000;
                    auVar131 = vblendmps_avx512vl(auVar180,local_5c0);
                    auVar161._0_4_ =
                         (uint)(bVar105 & 1) * auVar131._0_4_ |
                         (uint)!(bool)(bVar105 & 1) * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar106 >> 1) & 1);
                    auVar161._4_4_ = (uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar106 >> 2) & 1);
                    auVar161._8_4_ = (uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                    auVar161._12_4_ = (uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar106 >> 4) & 1);
                    auVar161._16_4_ = (uint)bVar20 * auVar131._16_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar106 >> 5) & 1);
                    auVar161._20_4_ = (uint)bVar20 * auVar131._20_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar106 >> 6) & 1);
                    auVar161._24_4_ = (uint)bVar20 * auVar131._24_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = SUB81(uVar106 >> 7,0);
                    auVar161._28_4_ = (uint)bVar20 * auVar131._28_4_ | (uint)!bVar20 * 0x7f800000;
                    auVar131 = vshufps_avx(auVar161,auVar161,0xb1);
                    auVar131 = vminps_avx(auVar161,auVar131);
                    auVar134 = vshufpd_avx(auVar131,auVar131,5);
                    auVar131 = vminps_avx(auVar131,auVar134);
                    auVar134 = vpermpd_avx2(auVar131,0x4e);
                    auVar131 = vminps_avx(auVar131,auVar134);
                    uVar188 = vcmpps_avx512vl(auVar161,auVar131,0);
                    uVar99 = (uint)uVar106;
                    if ((bVar105 & (byte)uVar188) != 0) {
                      uVar99 = (uint)(bVar105 & (byte)uVar188);
                    }
                    uVar98 = 0;
                    for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                      uVar98 = uVar98 + 1;
                    }
                    uVar97 = (ulong)uVar98;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar102->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_460 = vmovdqa64_avx512vl(auVar185._0_32_);
                      local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7c0._0_8_ = pGVar102;
                      local_7d8 = uVar101;
                      local_7a0 = local_5c0;
                      local_59c = iVar14;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar97]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar97 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_500 + uVar97 * 4);
                        local_830.context = context->user;
                        fVar187 = local_200._0_4_;
                        fVar223 = 1.0 - fVar187;
                        fVar191 = fVar223 * fVar223 * -3.0;
                        auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223)),
                                                   ZEXT416((uint)(fVar187 * fVar223)),
                                                   ZEXT416(0xc0000000));
                        auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar223)),
                                                   ZEXT416((uint)(fVar187 * fVar187)),
                                                   ZEXT416(0x40000000));
                        fVar223 = auVar110._0_4_ * 3.0;
                        fVar225 = auVar109._0_4_ * 3.0;
                        fVar187 = fVar187 * fVar187 * 3.0;
                        auVar217._0_4_ = fVar187 * fVar34;
                        auVar217._4_4_ = fVar187 * fVar78;
                        auVar217._8_4_ = fVar187 * fVar79;
                        auVar217._12_4_ = fVar187 * fVar95;
                        auVar173._4_4_ = fVar225;
                        auVar173._0_4_ = fVar225;
                        auVar173._8_4_ = fVar225;
                        auVar173._12_4_ = fVar225;
                        auVar110 = vfmadd132ps_fma(auVar173,auVar217,auVar112);
                        auVar204._4_4_ = fVar223;
                        auVar204._0_4_ = fVar223;
                        auVar204._8_4_ = fVar223;
                        auVar204._12_4_ = fVar223;
                        auVar110 = vfmadd132ps_fma(auVar204,auVar110,auVar172);
                        auVar174._4_4_ = fVar191;
                        auVar174._0_4_ = fVar191;
                        auVar174._8_4_ = fVar191;
                        auVar174._12_4_ = fVar191;
                        auVar110 = vfmadd132ps_fma(auVar174,auVar110,auVar7);
                        auVar185 = vbroadcastss_avx512f(auVar110);
                        auVar236 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar214 = vpermps_avx512f(auVar236,ZEXT1664(auVar110));
                        auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar110));
                        local_2c0[0] = (RTCHitN)auVar185[0];
                        local_2c0[1] = (RTCHitN)auVar185[1];
                        local_2c0[2] = (RTCHitN)auVar185[2];
                        local_2c0[3] = (RTCHitN)auVar185[3];
                        local_2c0[4] = (RTCHitN)auVar185[4];
                        local_2c0[5] = (RTCHitN)auVar185[5];
                        local_2c0[6] = (RTCHitN)auVar185[6];
                        local_2c0[7] = (RTCHitN)auVar185[7];
                        local_2c0[8] = (RTCHitN)auVar185[8];
                        local_2c0[9] = (RTCHitN)auVar185[9];
                        local_2c0[10] = (RTCHitN)auVar185[10];
                        local_2c0[0xb] = (RTCHitN)auVar185[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar185[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar185[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar185[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar185[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar185[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar185[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar185[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar185[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar185[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar185[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar185[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar185[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar185[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar185[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar185[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar185[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar185[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar185[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar185[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar185[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar185[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar185[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar185[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar185[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar185[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar185[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar185[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar185[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar185[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar185[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar185[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar185[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar185[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar185[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar185[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar185[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar185[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar185[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar185[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar185[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar185[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar185[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar185[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar185[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar185[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar185[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar185[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar185[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar185[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar185[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar185[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar185[0x3f];
                        local_280 = auVar214;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar185 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar185);
                        auVar131 = vpcmpeqd_avx2(auVar185._0_32_,auVar185._0_32_);
                        local_7e8[3] = auVar131;
                        local_7e8[2] = auVar131;
                        local_7e8[1] = auVar131;
                        *local_7e8 = auVar131;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar185 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar185);
                        local_830.valid = (int *)local_740;
                        local_830.geometryUserPtr = pGVar102->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar102->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          (*pGVar102->intersectionFilterN)(&local_830);
                          auVar221 = ZEXT3264(local_7a0);
                          auVar185 = vmovdqa64_avx512f(local_740);
                          pGVar102 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar188 = vptestmd_avx512f(auVar185,auVar185);
                        if ((short)uVar188 == 0) {
LAB_01b7d0ec:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_800._0_4_;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar102->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar214 = ZEXT1664(auVar214._0_16_);
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            (*p_Var19)(&local_830);
                            auVar221 = ZEXT3264(local_7a0);
                            auVar185 = vmovdqa64_avx512f(local_740);
                            pGVar102 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar101 = vptestmd_avx512f(auVar185,auVar185);
                          if ((short)uVar101 == 0) goto LAB_01b7d0ec;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar80 = *(int *)(local_830.hit + 0xc);
                          iVar81 = *(int *)(local_830.hit + 0x10);
                          iVar82 = *(int *)(local_830.hit + 0x14);
                          iVar83 = *(int *)(local_830.hit + 0x18);
                          iVar84 = *(int *)(local_830.hit + 0x1c);
                          iVar85 = *(int *)(local_830.hit + 0x20);
                          iVar86 = *(int *)(local_830.hit + 0x24);
                          iVar87 = *(int *)(local_830.hit + 0x28);
                          iVar88 = *(int *)(local_830.hit + 0x2c);
                          iVar89 = *(int *)(local_830.hit + 0x30);
                          iVar90 = *(int *)(local_830.hit + 0x34);
                          iVar91 = *(int *)(local_830.hit + 0x38);
                          iVar92 = *(int *)(local_830.hit + 0x3c);
                          bVar105 = (byte)uVar101;
                          bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar101 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar101 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar101 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar101 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar101 >> 6) & 1);
                          bVar26 = (bool)((byte)(uVar101 >> 7) & 1);
                          bVar96 = (byte)(uVar101 >> 8);
                          bVar27 = (bool)((byte)(uVar101 >> 9) & 1);
                          bVar28 = (bool)((byte)(uVar101 >> 10) & 1);
                          bVar29 = (bool)((byte)(uVar101 >> 0xb) & 1);
                          bVar30 = (bool)((byte)(uVar101 >> 0xc) & 1);
                          bVar31 = (bool)((byte)(uVar101 >> 0xd) & 1);
                          bVar32 = (bool)((byte)(uVar101 >> 0xe) & 1);
                          bVar33 = SUB81(uVar101 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar105 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar96 & 1) * iVar85 |
                               (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar27 * iVar86 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar28 * iVar87 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar29 * iVar88 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar30 * iVar89 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar31 * iVar90 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar32 * iVar91 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar33 * iVar92 |
                               (uint)!bVar33 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar80 = *(int *)(local_830.hit + 0x4c);
                          iVar81 = *(int *)(local_830.hit + 0x50);
                          iVar82 = *(int *)(local_830.hit + 0x54);
                          iVar83 = *(int *)(local_830.hit + 0x58);
                          iVar84 = *(int *)(local_830.hit + 0x5c);
                          iVar85 = *(int *)(local_830.hit + 0x60);
                          iVar86 = *(int *)(local_830.hit + 100);
                          iVar87 = *(int *)(local_830.hit + 0x68);
                          iVar88 = *(int *)(local_830.hit + 0x6c);
                          iVar89 = *(int *)(local_830.hit + 0x70);
                          iVar90 = *(int *)(local_830.hit + 0x74);
                          iVar91 = *(int *)(local_830.hit + 0x78);
                          iVar92 = *(int *)(local_830.hit + 0x7c);
                          bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar101 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar101 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar101 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar101 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar101 >> 6) & 1);
                          bVar26 = (bool)((byte)(uVar101 >> 7) & 1);
                          bVar27 = (bool)((byte)(uVar101 >> 9) & 1);
                          bVar28 = (bool)((byte)(uVar101 >> 10) & 1);
                          bVar29 = (bool)((byte)(uVar101 >> 0xb) & 1);
                          bVar30 = (bool)((byte)(uVar101 >> 0xc) & 1);
                          bVar31 = (bool)((byte)(uVar101 >> 0xd) & 1);
                          bVar32 = (bool)((byte)(uVar101 >> 0xe) & 1);
                          bVar33 = SUB81(uVar101 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar96 & 1) * iVar85 |
                               (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar27 * iVar86 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar28 * iVar87 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar29 * iVar88 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar30 * iVar89 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar31 * iVar90 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar32 * iVar91 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar33 * iVar92 |
                               (uint)!bVar33 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar80 = *(int *)(local_830.hit + 0x8c);
                          iVar81 = *(int *)(local_830.hit + 0x90);
                          iVar82 = *(int *)(local_830.hit + 0x94);
                          iVar83 = *(int *)(local_830.hit + 0x98);
                          iVar84 = *(int *)(local_830.hit + 0x9c);
                          iVar85 = *(int *)(local_830.hit + 0xa0);
                          iVar86 = *(int *)(local_830.hit + 0xa4);
                          iVar87 = *(int *)(local_830.hit + 0xa8);
                          iVar88 = *(int *)(local_830.hit + 0xac);
                          iVar89 = *(int *)(local_830.hit + 0xb0);
                          iVar90 = *(int *)(local_830.hit + 0xb4);
                          iVar91 = *(int *)(local_830.hit + 0xb8);
                          iVar92 = *(int *)(local_830.hit + 0xbc);
                          bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar101 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar101 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar101 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar101 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar101 >> 6) & 1);
                          bVar26 = (bool)((byte)(uVar101 >> 7) & 1);
                          bVar27 = (bool)((byte)(uVar101 >> 9) & 1);
                          bVar28 = (bool)((byte)(uVar101 >> 10) & 1);
                          bVar29 = (bool)((byte)(uVar101 >> 0xb) & 1);
                          bVar30 = (bool)((byte)(uVar101 >> 0xc) & 1);
                          bVar31 = (bool)((byte)(uVar101 >> 0xd) & 1);
                          bVar32 = (bool)((byte)(uVar101 >> 0xe) & 1);
                          bVar33 = SUB81(uVar101 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar96 & 1) * iVar85 |
                               (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar27 * iVar86 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar28 * iVar87 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar29 * iVar88 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar30 * iVar89 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar31 * iVar90 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar32 * iVar91 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar33 * iVar92 |
                               (uint)!bVar33 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar80 = *(int *)(local_830.hit + 0xcc);
                          iVar81 = *(int *)(local_830.hit + 0xd0);
                          iVar82 = *(int *)(local_830.hit + 0xd4);
                          iVar83 = *(int *)(local_830.hit + 0xd8);
                          iVar84 = *(int *)(local_830.hit + 0xdc);
                          iVar85 = *(int *)(local_830.hit + 0xe0);
                          iVar86 = *(int *)(local_830.hit + 0xe4);
                          iVar87 = *(int *)(local_830.hit + 0xe8);
                          iVar88 = *(int *)(local_830.hit + 0xec);
                          iVar89 = *(int *)(local_830.hit + 0xf0);
                          iVar90 = *(int *)(local_830.hit + 0xf4);
                          iVar91 = *(int *)(local_830.hit + 0xf8);
                          iVar92 = *(int *)(local_830.hit + 0xfc);
                          bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar101 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar101 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar101 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar101 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar101 >> 6) & 1);
                          bVar26 = (bool)((byte)(uVar101 >> 7) & 1);
                          bVar27 = (bool)((byte)(uVar101 >> 9) & 1);
                          bVar28 = (bool)((byte)(uVar101 >> 10) & 1);
                          bVar29 = (bool)((byte)(uVar101 >> 0xb) & 1);
                          bVar30 = (bool)((byte)(uVar101 >> 0xc) & 1);
                          bVar31 = (bool)((byte)(uVar101 >> 0xd) & 1);
                          bVar32 = (bool)((byte)(uVar101 >> 0xe) & 1);
                          bVar33 = SUB81(uVar101 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar96 & 1) * iVar85 |
                               (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar27 * iVar86 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar28 * iVar87 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar29 * iVar88 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar30 * iVar89 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar31 * iVar90 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar32 * iVar91 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar33 * iVar92 |
                               (uint)!bVar33 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar80 = *(int *)(local_830.hit + 0x10c);
                          iVar81 = *(int *)(local_830.hit + 0x110);
                          iVar82 = *(int *)(local_830.hit + 0x114);
                          iVar83 = *(int *)(local_830.hit + 0x118);
                          iVar84 = *(int *)(local_830.hit + 0x11c);
                          iVar85 = *(int *)(local_830.hit + 0x120);
                          iVar86 = *(int *)(local_830.hit + 0x124);
                          iVar87 = *(int *)(local_830.hit + 0x128);
                          iVar88 = *(int *)(local_830.hit + 300);
                          iVar89 = *(int *)(local_830.hit + 0x130);
                          iVar90 = *(int *)(local_830.hit + 0x134);
                          iVar91 = *(int *)(local_830.hit + 0x138);
                          iVar92 = *(int *)(local_830.hit + 0x13c);
                          bVar20 = (bool)((byte)(uVar101 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar101 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar101 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar101 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar101 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar101 >> 6) & 1);
                          bVar26 = (bool)((byte)(uVar101 >> 7) & 1);
                          bVar27 = (bool)((byte)(uVar101 >> 9) & 1);
                          bVar28 = (bool)((byte)(uVar101 >> 10) & 1);
                          bVar29 = (bool)((byte)(uVar101 >> 0xb) & 1);
                          bVar30 = (bool)((byte)(uVar101 >> 0xc) & 1);
                          bVar31 = (bool)((byte)(uVar101 >> 0xd) & 1);
                          bVar32 = (bool)((byte)(uVar101 >> 0xe) & 1);
                          bVar33 = SUB81(uVar101 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar105 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar105 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar96 & 1) * iVar85 |
                               (uint)!(bool)(bVar96 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar27 * iVar86 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar28 * iVar87 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar29 * iVar88 |
                               (uint)!bVar29 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar30 * iVar89 |
                               (uint)!bVar30 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar31 * iVar90 |
                               (uint)!bVar31 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar32 * iVar91 |
                               (uint)!bVar32 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar33 * iVar92 |
                               (uint)!bVar33 * *(int *)(local_830.ray + 0x43c);
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar185 = vmovdqu32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar185;
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar185 = vmovdqu32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar185;
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar185 = vmovdqa32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar185;
                          auVar185 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar185 = vmovdqa32_avx512f(auVar185);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar185;
                          local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_800._4_4_ = 0;
                          local_800._8_4_ = 0;
                          local_800._12_4_ = 0;
                        }
                        bVar105 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & (byte)uVar106;
                        auVar181._4_4_ = local_800._0_4_;
                        auVar181._0_4_ = local_800._0_4_;
                        auVar181._8_4_ = local_800._0_4_;
                        auVar181._12_4_ = local_800._0_4_;
                        auVar181._16_4_ = local_800._0_4_;
                        auVar181._20_4_ = local_800._0_4_;
                        auVar181._24_4_ = local_800._0_4_;
                        auVar181._28_4_ = local_800._0_4_;
                        uVar188 = vcmpps_avx512vl(auVar221._0_32_,auVar181,2);
                        if ((bVar105 & (byte)uVar188) == 0) goto LAB_01b7d192;
                        bVar105 = bVar105 & (byte)uVar188;
                        auVar182._8_4_ = 0x7f800000;
                        auVar182._0_8_ = 0x7f8000007f800000;
                        auVar182._12_4_ = 0x7f800000;
                        auVar182._16_4_ = 0x7f800000;
                        auVar182._20_4_ = 0x7f800000;
                        auVar182._24_4_ = 0x7f800000;
                        auVar182._28_4_ = 0x7f800000;
                        auVar131 = vblendmps_avx512vl(auVar182,auVar221._0_32_);
                        auVar162._0_4_ =
                             (uint)(bVar105 & 1) * auVar131._0_4_ |
                             (uint)!(bool)(bVar105 & 1) * 0x7f800000;
                        bVar20 = (bool)(bVar105 >> 1 & 1);
                        auVar162._4_4_ = (uint)bVar20 * auVar131._4_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar105 >> 2 & 1);
                        auVar162._8_4_ = (uint)bVar20 * auVar131._8_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar105 >> 3 & 1);
                        auVar162._12_4_ =
                             (uint)bVar20 * auVar131._12_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar105 >> 4 & 1);
                        auVar162._16_4_ =
                             (uint)bVar20 * auVar131._16_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar105 >> 5 & 1);
                        auVar162._20_4_ =
                             (uint)bVar20 * auVar131._20_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar105 >> 6 & 1);
                        auVar162._24_4_ =
                             (uint)bVar20 * auVar131._24_4_ | (uint)!bVar20 * 0x7f800000;
                        auVar162._28_4_ =
                             (uint)(bVar105 >> 7) * auVar131._28_4_ |
                             (uint)!(bool)(bVar105 >> 7) * 0x7f800000;
                        auVar131 = vshufps_avx(auVar162,auVar162,0xb1);
                        auVar131 = vminps_avx(auVar162,auVar131);
                        auVar134 = vshufpd_avx(auVar131,auVar131,5);
                        auVar131 = vminps_avx(auVar131,auVar134);
                        auVar134 = vpermpd_avx2(auVar131,0x4e);
                        auVar131 = vminps_avx(auVar131,auVar134);
                        uVar188 = vcmpps_avx512vl(auVar162,auVar131,0);
                        bVar96 = (byte)uVar188 & bVar105;
                        uVar106 = (ulong)bVar105;
                        if (bVar96 != 0) {
                          bVar105 = bVar96;
                        }
                        uVar99 = 0;
                        for (uVar98 = (uint)bVar105; (uVar98 & 1) == 0;
                            uVar98 = uVar98 >> 1 | 0x80000000) {
                          uVar99 = uVar99 + 1;
                        }
                        uVar97 = (ulong)uVar99;
                      } while( true );
                    }
                    fVar191 = local_540[uVar97];
                    uVar186 = *(undefined4 *)(local_520 + uVar97 * 4);
                    fVar225 = 1.0 - fVar191;
                    fVar223 = fVar225 * fVar225 * -3.0;
                    auVar214 = ZEXT464((uint)fVar223);
                    auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * fVar225)),
                                               ZEXT416((uint)(fVar191 * fVar225)),
                                               ZEXT416(0xc0000000));
                    auVar109 = vfmsub132ss_fma(ZEXT416((uint)(fVar191 * fVar225)),
                                               ZEXT416((uint)(fVar191 * fVar191)),
                                               ZEXT416(0x40000000));
                    fVar225 = auVar110._0_4_ * 3.0;
                    fVar187 = auVar109._0_4_ * 3.0;
                    fVar199 = fVar191 * fVar191 * 3.0;
                    auVar216._0_4_ = fVar199 * fVar34;
                    auVar216._4_4_ = fVar199 * fVar78;
                    auVar216._8_4_ = fVar199 * fVar79;
                    auVar216._12_4_ = fVar199 * fVar95;
                    auVar219 = ZEXT1664(auVar216);
                    auVar194._4_4_ = fVar187;
                    auVar194._0_4_ = fVar187;
                    auVar194._8_4_ = fVar187;
                    auVar194._12_4_ = fVar187;
                    auVar110 = vfmadd132ps_fma(auVar194,auVar216,auVar112);
                    auVar203._4_4_ = fVar225;
                    auVar203._0_4_ = fVar225;
                    auVar203._8_4_ = fVar225;
                    auVar203._12_4_ = fVar225;
                    auVar110 = vfmadd132ps_fma(auVar203,auVar110,auVar172);
                    auVar195._4_4_ = fVar223;
                    auVar195._0_4_ = fVar223;
                    auVar195._8_4_ = fVar223;
                    auVar195._12_4_ = fVar223;
                    auVar110 = vfmadd132ps_fma(auVar195,auVar110,auVar7);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_500 + uVar97 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar110._0_4_;
                    uVar15 = vextractps_avx(auVar110,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar15;
                    uVar15 = vextractps_avx(auVar110,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar15;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar191;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar186;
                    *(int *)(ray + k * 4 + 0x440) = (int)uVar101;
                    *(uint *)(ray + k * 4 + 0x480) = uVar13;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b7cdc1;
      }
    }
    uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar41._4_4_ = uVar186;
    auVar41._0_4_ = uVar186;
    auVar41._8_4_ = uVar186;
    auVar41._12_4_ = uVar186;
    auVar41._16_4_ = uVar186;
    auVar41._20_4_ = uVar186;
    auVar41._24_4_ = uVar186;
    auVar41._28_4_ = uVar186;
    uVar188 = vcmpps_avx512vl(local_3a0,auVar41,2);
    local_7c8 = (ulong)((uint)local_7c8 & (uint)local_7c8 + 0xff & (uint)uVar188);
  } while( true );
LAB_01b7d192:
  auVar131 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar237 = ZEXT3264(auVar131);
  auVar131 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar236 = ZEXT3264(auVar131);
  auVar131 = vmovdqa64_avx512vl(local_460);
  auVar185 = ZEXT3264(auVar131);
  uVar101 = local_7d8;
LAB_01b7cdc1:
  lVar100 = lVar100 + 8;
  goto LAB_01b7c519;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }